

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O3

void embree::sse2::CurveNiMBIntersectorK<4,4>::
     intersect_h<embree::sse2::RibbonCurve1IntersectorK<embree::HermiteCurveT,4,4>,embree::sse2::Intersect1KEpilogMU<4,4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  Primitive *pPVar7;
  undefined1 (*pauVar8) [16];
  undefined1 (*pauVar9) [12];
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  Primitive PVar21;
  int iVar22;
  Geometry *pGVar23;
  __int_type_conflict _Var24;
  long lVar25;
  long lVar26;
  undefined1 auVar27 [16];
  RTCFeatureFlags RVar28;
  undefined1 auVar29 [16];
  undefined6 uVar30;
  undefined1 auVar31 [12];
  undefined1 auVar32 [12];
  undefined1 auVar33 [12];
  undefined1 auVar34 [12];
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  bool bVar52;
  bool bVar53;
  bool bVar54;
  bool bVar55;
  undefined1 auVar56 [16];
  int iVar57;
  undefined4 uVar58;
  ulong uVar59;
  long lVar60;
  RTCFilterFunctionN p_Var61;
  RayHitK<4> *pRVar62;
  RTCIntersectArguments *pRVar63;
  int iVar65;
  RTCIntersectArguments *pRVar66;
  RTCIntersectArguments *pRVar67;
  ulong uVar68;
  Geometry *pGVar69;
  long lVar70;
  long lVar71;
  uint uVar72;
  uint uVar73;
  uint uVar74;
  uint uVar75;
  uint uVar76;
  uint uVar77;
  uint uVar78;
  uint uVar79;
  short sVar80;
  undefined2 uVar115;
  float fVar81;
  float fVar116;
  float fVar117;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar86 [16];
  undefined1 auVar89 [16];
  undefined1 auVar92 [16];
  undefined1 auVar95 [16];
  undefined1 auVar98 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined8 uVar118;
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar119;
  float fVar120;
  float fVar154;
  float fVar156;
  undefined1 auVar121 [16];
  undefined1 auVar124 [16];
  undefined1 auVar127 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar155;
  float fVar157;
  float fVar158;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  float fVar159;
  float fVar169;
  float fVar170;
  vfloat4 v;
  undefined1 auVar160 [16];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar171;
  float fVar188;
  float fVar191;
  vfloat4 v_1;
  undefined1 auVar174 [16];
  float fVar172;
  float fVar173;
  undefined1 auVar175 [16];
  undefined1 auVar178 [16];
  float fVar189;
  float fVar190;
  float fVar192;
  float fVar193;
  float fVar194;
  float fVar195;
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  float fVar196;
  float fVar204;
  float fVar205;
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar229;
  float fVar230;
  undefined1 auVar207 [16];
  undefined1 auVar210 [16];
  undefined1 auVar213 [16];
  undefined1 auVar216 [16];
  undefined1 auVar219 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  float fVar231;
  float fVar235;
  float fVar236;
  undefined1 auVar232 [16];
  undefined1 auVar233 [16];
  undefined1 auVar234 [16];
  float fVar237;
  float fVar238;
  float fVar245;
  float fVar247;
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  float fVar246;
  float fVar248;
  float fVar249;
  float fVar250;
  float fVar251;
  undefined1 auVar244 [16];
  float fVar252;
  float fVar254;
  float fVar255;
  undefined1 auVar253 [16];
  float fVar256;
  float fVar263;
  float fVar264;
  undefined1 auVar257 [16];
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar265;
  float fVar266;
  float fVar267;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  float fVar280;
  undefined1 auVar268 [16];
  undefined1 auVar271 [16];
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  float fVar281;
  float fVar282;
  float fVar283;
  float fVar290;
  float fVar291;
  float fVar292;
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar293;
  float fVar302;
  float fVar303;
  float fVar304;
  undefined1 auVar294 [16];
  undefined1 auVar295 [16];
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  float fVar305;
  float fVar306;
  float fVar311;
  float fVar312;
  float fVar313;
  undefined1 auVar307 [16];
  undefined1 auVar308 [16];
  undefined1 auVar309 [16];
  undefined1 auVar310 [16];
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  float fVar317;
  float fVar318;
  float fVar319;
  float fVar320;
  float fVar321;
  float fVar322;
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  RibbonHit<embree::HermiteCurveT<embree::Vec3fx>,_4> bhit;
  undefined1 local_518 [8];
  float fStack_510;
  undefined4 uStack_50c;
  undefined8 local_508;
  undefined8 uStack_500;
  undefined8 local_4e8;
  undefined8 uStack_4e0;
  float local_458;
  float local_448;
  float fStack_444;
  float fStack_440;
  float fStack_43c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  undefined1 local_408 [16];
  undefined1 local_3f8 [16];
  Primitive *local_3e8;
  Precalculations *local_3e0;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  undefined1 local_388 [8];
  float fStack_380;
  float fStack_37c;
  RTCFilterFunctionNArguments local_378;
  float local_348;
  float fStack_344;
  float fStack_340;
  float fStack_33c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_328;
  float fStack_324;
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_308;
  float fStack_304;
  float fStack_300;
  float fStack_2fc;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2e8;
  float fStack_2e4;
  float fStack_2e0;
  float fStack_2dc;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  undefined1 (*local_2c8) [16];
  RayHitK<4> *local_2c0;
  undefined1 local_2b8 [8];
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_288;
  float fStack_284;
  float fStack_280;
  float fStack_27c;
  undefined1 local_278 [8];
  float fStack_270;
  float local_268;
  float fStack_264;
  float fStack_260;
  float fStack_25c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_248;
  float fStack_244;
  float fStack_240;
  float fStack_23c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  LinearSpace3fa *local_210;
  float local_208;
  float fStack_204;
  float fStack_200;
  float fStack_1fc;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1e8;
  float fStack_1e4;
  float fStack_1e0;
  float fStack_1dc;
  uint local_1d8;
  int local_1d4;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined1 local_188 [16];
  float local_178 [4];
  undefined8 local_168;
  undefined8 uStack_160;
  float local_158 [4];
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_128;
  float fStack_124;
  float fStack_120;
  float fStack_11c;
  undefined1 local_118 [12];
  float fStack_10c;
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  undefined4 local_d8;
  undefined4 uStack_d4;
  undefined4 uStack_d0;
  undefined4 uStack_cc;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  uint local_78;
  uint uStack_74;
  uint uStack_70;
  uint uStack_6c;
  uint local_68;
  uint uStack_64;
  uint uStack_60;
  uint uStack_5c;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  float local_48;
  float fStack_44;
  float fStack_40;
  float fStack_3c;
  ulong uVar64;
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 uVar114;
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar211 [16];
  undefined1 auVar212 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar258 [16];
  undefined1 auVar259 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar286 [16];
  undefined1 auVar287 [16];
  undefined1 auVar296 [16];
  undefined1 auVar297 [16];
  
  PVar21 = prim[1];
  uVar59 = (ulong)(byte)PVar21;
  lVar26 = uVar59 * 0x25;
  pPVar7 = prim + lVar26 + 6;
  fVar170 = *(float *)(pPVar7 + 0xc);
  fVar171 = (*(float *)(ray + k * 4) - *(float *)pPVar7) * fVar170;
  fVar188 = (*(float *)(ray + k * 4 + 0x10) - *(float *)(pPVar7 + 4)) * fVar170;
  fVar191 = (*(float *)(ray + k * 4 + 0x20) - *(float *)(pPVar7 + 8)) * fVar170;
  fVar159 = *(float *)(ray + k * 4 + 0x40) * fVar170;
  fVar169 = *(float *)(ray + k * 4 + 0x50) * fVar170;
  fVar170 = *(float *)(ray + k * 4 + 0x60) * fVar170;
  uVar58 = *(undefined4 *)(prim + uVar59 * 4 + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar261._8_4_ = 0;
  auVar261._0_8_ = uVar64;
  auVar261._12_2_ = uVar115;
  auVar261._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar161._12_4_ = auVar261._12_4_;
  auVar161._8_2_ = 0;
  auVar161._0_8_ = uVar64;
  auVar161._10_2_ = uVar115;
  auVar82._10_6_ = auVar161._10_6_;
  auVar82._8_2_ = uVar115;
  auVar82._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar31._4_8_ = auVar82._8_8_;
  auVar31._2_2_ = uVar115;
  auVar31._0_2_ = uVar115;
  fVar305 = (float)((int)sVar80 >> 8);
  fVar311 = (float)(auVar31._0_4_ >> 0x18);
  fVar312 = (float)(auVar82._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 5 + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar123._8_4_ = 0;
  auVar123._0_8_ = uVar64;
  auVar123._12_2_ = uVar115;
  auVar123._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar122._12_4_ = auVar123._12_4_;
  auVar122._8_2_ = 0;
  auVar122._0_8_ = uVar64;
  auVar122._10_2_ = uVar115;
  auVar121._10_6_ = auVar122._10_6_;
  auVar121._8_2_ = uVar115;
  auVar121._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar32._4_8_ = auVar121._8_8_;
  auVar32._2_2_ = uVar115;
  auVar32._0_2_ = uVar115;
  fVar196 = (float)((int)sVar80 >> 8);
  fVar204 = (float)(auVar32._0_4_ >> 0x18);
  fVar205 = (float)(auVar121._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 6 + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar126._8_4_ = 0;
  auVar126._0_8_ = uVar64;
  auVar126._12_2_ = uVar115;
  auVar126._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar125._12_4_ = auVar126._12_4_;
  auVar125._8_2_ = 0;
  auVar125._0_8_ = uVar64;
  auVar125._10_2_ = uVar115;
  auVar124._10_6_ = auVar125._10_6_;
  auVar124._8_2_ = uVar115;
  auVar124._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar33._4_8_ = auVar124._8_8_;
  auVar33._2_2_ = uVar115;
  auVar33._0_2_ = uVar115;
  fVar231 = (float)((int)sVar80 >> 8);
  fVar235 = (float)(auVar33._0_4_ >> 0x18);
  fVar236 = (float)(auVar124._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 0xf + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar129._8_4_ = 0;
  auVar129._0_8_ = uVar64;
  auVar129._12_2_ = uVar115;
  auVar129._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar128._12_4_ = auVar129._12_4_;
  auVar128._8_2_ = 0;
  auVar128._0_8_ = uVar64;
  auVar128._10_2_ = uVar115;
  auVar127._10_6_ = auVar128._10_6_;
  auVar127._8_2_ = uVar115;
  auVar127._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar34._4_8_ = auVar127._8_8_;
  auVar34._2_2_ = uVar115;
  auVar34._0_2_ = uVar115;
  fVar81 = (float)((int)sVar80 >> 8);
  fVar116 = (float)(auVar34._0_4_ >> 0x18);
  fVar117 = (float)(auVar127._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar209._8_4_ = 0;
  auVar209._0_8_ = uVar64;
  auVar209._12_2_ = uVar115;
  auVar209._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar208._12_4_ = auVar209._12_4_;
  auVar208._8_2_ = 0;
  auVar208._0_8_ = uVar64;
  auVar208._10_2_ = uVar115;
  auVar207._10_6_ = auVar208._10_6_;
  auVar207._8_2_ = uVar115;
  auVar207._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar35._4_8_ = auVar207._8_8_;
  auVar35._2_2_ = uVar115;
  auVar35._0_2_ = uVar115;
  fVar237 = (float)((int)sVar80 >> 8);
  fVar245 = (float)(auVar35._0_4_ >> 0x18);
  fVar247 = (float)(auVar207._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + (ulong)(byte)PVar21 * 0x10 + uVar59 + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar212._8_4_ = 0;
  auVar212._0_8_ = uVar64;
  auVar212._12_2_ = uVar115;
  auVar212._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar211._12_4_ = auVar212._12_4_;
  auVar211._8_2_ = 0;
  auVar211._0_8_ = uVar64;
  auVar211._10_2_ = uVar115;
  auVar210._10_6_ = auVar211._10_6_;
  auVar210._8_2_ = uVar115;
  auVar210._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar36._4_8_ = auVar210._8_8_;
  auVar36._2_2_ = uVar115;
  auVar36._0_2_ = uVar115;
  fVar256 = (float)((int)sVar80 >> 8);
  fVar263 = (float)(auVar36._0_4_ >> 0x18);
  fVar264 = (float)(auVar210._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 0x1a + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar215._8_4_ = 0;
  auVar215._0_8_ = uVar64;
  auVar215._12_2_ = uVar115;
  auVar215._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar214._12_4_ = auVar215._12_4_;
  auVar214._8_2_ = 0;
  auVar214._0_8_ = uVar64;
  auVar214._10_2_ = uVar115;
  auVar213._10_6_ = auVar214._10_6_;
  auVar213._8_2_ = uVar115;
  auVar213._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar37._4_8_ = auVar213._8_8_;
  auVar37._2_2_ = uVar115;
  auVar37._0_2_ = uVar115;
  fVar252 = (float)((int)sVar80 >> 8);
  fVar254 = (float)(auVar37._0_4_ >> 0x18);
  fVar255 = (float)(auVar213._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 0x1b + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar218._8_4_ = 0;
  auVar218._0_8_ = uVar64;
  auVar218._12_2_ = uVar115;
  auVar218._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar217._12_4_ = auVar218._12_4_;
  auVar217._8_2_ = 0;
  auVar217._0_8_ = uVar64;
  auVar217._10_2_ = uVar115;
  auVar216._10_6_ = auVar217._10_6_;
  auVar216._8_2_ = uVar115;
  auVar216._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar38._4_8_ = auVar216._8_8_;
  auVar38._2_2_ = uVar115;
  auVar38._0_2_ = uVar115;
  fVar265 = (float)((int)sVar80 >> 8);
  fVar275 = (float)(auVar38._0_4_ >> 0x18);
  fVar278 = (float)(auVar216._8_4_ >> 0x18);
  uVar58 = *(undefined4 *)(prim + uVar59 * 0x1c + 6);
  uVar114 = (undefined1)((uint)uVar58 >> 0x18);
  uVar115 = CONCAT11(uVar114,uVar114);
  uVar114 = (undefined1)((uint)uVar58 >> 0x10);
  uVar118 = CONCAT35(CONCAT21(uVar115,uVar114),CONCAT14(uVar114,uVar58));
  uVar114 = (undefined1)((uint)uVar58 >> 8);
  uVar30 = CONCAT51(CONCAT41((int)((ulong)uVar118 >> 0x20),uVar114),uVar114);
  sVar80 = CONCAT11((char)uVar58,(char)uVar58);
  uVar64 = CONCAT62(uVar30,sVar80);
  auVar221._8_4_ = 0;
  auVar221._0_8_ = uVar64;
  auVar221._12_2_ = uVar115;
  auVar221._14_2_ = uVar115;
  uVar115 = (undefined2)((ulong)uVar118 >> 0x20);
  auVar220._12_4_ = auVar221._12_4_;
  auVar220._8_2_ = 0;
  auVar220._0_8_ = uVar64;
  auVar220._10_2_ = uVar115;
  auVar219._10_6_ = auVar220._10_6_;
  auVar219._8_2_ = uVar115;
  auVar219._0_8_ = uVar64;
  uVar115 = (undefined2)uVar30;
  auVar39._4_8_ = auVar219._8_8_;
  auVar39._2_2_ = uVar115;
  auVar39._0_2_ = uVar115;
  fVar119 = (float)((int)sVar80 >> 8);
  fVar154 = (float)(auVar39._0_4_ >> 0x18);
  fVar156 = (float)(auVar219._8_4_ >> 0x18);
  fVar293 = fVar159 * fVar305 + fVar169 * fVar196 + fVar170 * fVar231;
  fVar302 = fVar159 * fVar311 + fVar169 * fVar204 + fVar170 * fVar235;
  fVar303 = fVar159 * fVar312 + fVar169 * fVar205 + fVar170 * fVar236;
  fVar304 = fVar159 * (float)(auVar161._12_4_ >> 0x18) +
            fVar169 * (float)(auVar122._12_4_ >> 0x18) + fVar170 * (float)(auVar125._12_4_ >> 0x18);
  fVar283 = fVar159 * fVar81 + fVar169 * fVar237 + fVar170 * fVar256;
  fVar290 = fVar159 * fVar116 + fVar169 * fVar245 + fVar170 * fVar263;
  fVar291 = fVar159 * fVar117 + fVar169 * fVar247 + fVar170 * fVar264;
  fVar292 = fVar159 * (float)(auVar128._12_4_ >> 0x18) +
            fVar169 * (float)(auVar208._12_4_ >> 0x18) + fVar170 * (float)(auVar211._12_4_ >> 0x18);
  fVar206 = fVar159 * fVar252 + fVar169 * fVar265 + fVar170 * fVar119;
  fVar229 = fVar159 * fVar254 + fVar169 * fVar275 + fVar170 * fVar154;
  fVar230 = fVar159 * fVar255 + fVar169 * fVar278 + fVar170 * fVar156;
  fVar159 = fVar159 * (float)(auVar214._12_4_ >> 0x18) +
            fVar169 * (float)(auVar217._12_4_ >> 0x18) + fVar170 * (float)(auVar220._12_4_ >> 0x18);
  fVar306 = fVar305 * fVar171 + fVar196 * fVar188 + fVar231 * fVar191;
  fVar311 = fVar311 * fVar171 + fVar204 * fVar188 + fVar235 * fVar191;
  fVar312 = fVar312 * fVar171 + fVar205 * fVar188 + fVar236 * fVar191;
  fVar313 = (float)(auVar161._12_4_ >> 0x18) * fVar171 +
            (float)(auVar122._12_4_ >> 0x18) * fVar188 + (float)(auVar125._12_4_ >> 0x18) * fVar191;
  fVar256 = fVar81 * fVar171 + fVar237 * fVar188 + fVar256 * fVar191;
  fVar263 = fVar116 * fVar171 + fVar245 * fVar188 + fVar263 * fVar191;
  fVar264 = fVar117 * fVar171 + fVar247 * fVar188 + fVar264 * fVar191;
  fVar305 = (float)(auVar128._12_4_ >> 0x18) * fVar171 +
            (float)(auVar208._12_4_ >> 0x18) * fVar188 + (float)(auVar211._12_4_ >> 0x18) * fVar191;
  fVar252 = fVar171 * fVar252 + fVar188 * fVar265 + fVar191 * fVar119;
  fVar254 = fVar171 * fVar254 + fVar188 * fVar275 + fVar191 * fVar154;
  fVar255 = fVar171 * fVar255 + fVar188 * fVar278 + fVar191 * fVar156;
  fVar265 = fVar171 * (float)(auVar214._12_4_ >> 0x18) +
            fVar188 * (float)(auVar217._12_4_ >> 0x18) + fVar191 * (float)(auVar220._12_4_ >> 0x18);
  fVar170 = (float)DAT_01f80d30;
  fVar81 = DAT_01f80d30._4_4_;
  fVar116 = DAT_01f80d30._8_4_;
  fVar117 = DAT_01f80d30._12_4_;
  uVar72 = -(uint)(fVar170 <= ABS(fVar293));
  uVar73 = -(uint)(fVar81 <= ABS(fVar302));
  uVar75 = -(uint)(fVar116 <= ABS(fVar303));
  uVar77 = -(uint)(fVar117 <= ABS(fVar304));
  auVar294._0_4_ = (uint)fVar293 & uVar72;
  auVar294._4_4_ = (uint)fVar302 & uVar73;
  auVar294._8_4_ = (uint)fVar303 & uVar75;
  auVar294._12_4_ = (uint)fVar304 & uVar77;
  auVar174._0_4_ = ~uVar72 & (uint)fVar170;
  auVar174._4_4_ = ~uVar73 & (uint)fVar81;
  auVar174._8_4_ = ~uVar75 & (uint)fVar116;
  auVar174._12_4_ = ~uVar77 & (uint)fVar117;
  auVar174 = auVar174 | auVar294;
  uVar72 = -(uint)(fVar170 <= ABS(fVar283));
  uVar73 = -(uint)(fVar81 <= ABS(fVar290));
  uVar75 = -(uint)(fVar116 <= ABS(fVar291));
  uVar77 = -(uint)(fVar117 <= ABS(fVar292));
  auVar284._0_4_ = (uint)fVar283 & uVar72;
  auVar284._4_4_ = (uint)fVar290 & uVar73;
  auVar284._8_4_ = (uint)fVar291 & uVar75;
  auVar284._12_4_ = (uint)fVar292 & uVar77;
  auVar232._0_4_ = ~uVar72 & (uint)fVar170;
  auVar232._4_4_ = ~uVar73 & (uint)fVar81;
  auVar232._8_4_ = ~uVar75 & (uint)fVar116;
  auVar232._12_4_ = ~uVar77 & (uint)fVar117;
  auVar232 = auVar232 | auVar284;
  uVar72 = -(uint)(fVar170 <= ABS(fVar206));
  uVar73 = -(uint)(fVar81 <= ABS(fVar229));
  uVar75 = -(uint)(fVar116 <= ABS(fVar230));
  uVar77 = -(uint)(fVar117 <= ABS(fVar159));
  auVar222._0_4_ = (uint)fVar206 & uVar72;
  auVar222._4_4_ = (uint)fVar229 & uVar73;
  auVar222._8_4_ = (uint)fVar230 & uVar75;
  auVar222._12_4_ = (uint)fVar159 & uVar77;
  auVar239._0_4_ = ~uVar72 & (uint)fVar170;
  auVar239._4_4_ = ~uVar73 & (uint)fVar81;
  auVar239._8_4_ = ~uVar75 & (uint)fVar116;
  auVar239._12_4_ = ~uVar77 & (uint)fVar117;
  auVar239 = auVar239 | auVar222;
  auVar82 = rcpps(_DAT_01f80d30,auVar174);
  fVar170 = auVar82._0_4_;
  fVar117 = auVar82._4_4_;
  fVar196 = auVar82._8_4_;
  fVar237 = auVar82._12_4_;
  fVar170 = (1.0 - auVar174._0_4_ * fVar170) * fVar170 + fVar170;
  fVar117 = (1.0 - auVar174._4_4_ * fVar117) * fVar117 + fVar117;
  fVar196 = (1.0 - auVar174._8_4_ * fVar196) * fVar196 + fVar196;
  fVar237 = (1.0 - auVar174._12_4_ * fVar237) * fVar237 + fVar237;
  auVar82 = rcpps(auVar82,auVar232);
  fVar81 = auVar82._0_4_;
  fVar119 = auVar82._4_4_;
  fVar204 = auVar82._8_4_;
  fVar245 = auVar82._12_4_;
  fVar81 = (1.0 - auVar232._0_4_ * fVar81) * fVar81 + fVar81;
  fVar119 = (1.0 - auVar232._4_4_ * fVar119) * fVar119 + fVar119;
  fVar204 = (1.0 - auVar232._8_4_ * fVar204) * fVar204 + fVar204;
  fVar245 = (1.0 - auVar232._12_4_ * fVar245) * fVar245 + fVar245;
  auVar82 = rcpps(auVar82,auVar239);
  fVar116 = auVar82._0_4_;
  fVar154 = auVar82._4_4_;
  fVar205 = auVar82._8_4_;
  fVar247 = auVar82._12_4_;
  fVar116 = (1.0 - auVar239._0_4_ * fVar116) * fVar116 + fVar116;
  fVar154 = (1.0 - auVar239._4_4_ * fVar154) * fVar154 + fVar154;
  fVar205 = (1.0 - auVar239._8_4_ * fVar205) * fVar205 + fVar205;
  fVar247 = (1.0 - auVar239._12_4_ * fVar247) * fVar247 + fVar247;
  fVar275 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar26 + 0x16)) *
            *(float *)(prim + lVar26 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar59 * 7 + 6);
  uVar115 = (undefined2)(uVar64 >> 0x30);
  auVar85._8_4_ = 0;
  auVar85._0_8_ = uVar64;
  auVar85._12_2_ = uVar115;
  auVar85._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar64 >> 0x20);
  auVar84._12_4_ = auVar85._12_4_;
  auVar84._8_2_ = 0;
  auVar84._0_8_ = uVar64;
  auVar84._10_2_ = uVar115;
  auVar83._10_6_ = auVar84._10_6_;
  auVar83._8_2_ = uVar115;
  auVar83._0_8_ = uVar64;
  uVar115 = (undefined2)(uVar64 >> 0x10);
  auVar40._4_8_ = auVar83._8_8_;
  auVar40._2_2_ = uVar115;
  auVar40._0_2_ = uVar115;
  fVar156 = (float)(auVar40._0_4_ >> 0x10);
  fVar206 = (float)(auVar83._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar59 * 0xb + 6);
  uVar115 = (undefined2)(uVar10 >> 0x30);
  auVar177._8_4_ = 0;
  auVar177._0_8_ = uVar10;
  auVar177._12_2_ = uVar115;
  auVar177._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar10 >> 0x20);
  auVar176._12_4_ = auVar177._12_4_;
  auVar176._8_2_ = 0;
  auVar176._0_8_ = uVar10;
  auVar176._10_2_ = uVar115;
  auVar175._10_6_ = auVar176._10_6_;
  auVar175._8_2_ = uVar115;
  auVar175._0_8_ = uVar10;
  uVar115 = (undefined2)(uVar10 >> 0x10);
  auVar41._4_8_ = auVar175._8_8_;
  auVar41._2_2_ = uVar115;
  auVar41._0_2_ = uVar115;
  uVar11 = *(ulong *)(prim + uVar59 * 9 + 6);
  uVar115 = (undefined2)(uVar11 >> 0x30);
  auVar88._8_4_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._12_2_ = uVar115;
  auVar88._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar11 >> 0x20);
  auVar87._12_4_ = auVar88._12_4_;
  auVar87._8_2_ = 0;
  auVar87._0_8_ = uVar11;
  auVar87._10_2_ = uVar115;
  auVar86._10_6_ = auVar87._10_6_;
  auVar86._8_2_ = uVar115;
  auVar86._0_8_ = uVar11;
  uVar115 = (undefined2)(uVar11 >> 0x10);
  auVar42._4_8_ = auVar86._8_8_;
  auVar42._2_2_ = uVar115;
  auVar42._0_2_ = uVar115;
  fVar159 = (float)(auVar42._0_4_ >> 0x10);
  fVar229 = (float)(auVar86._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar59 * 0xd + 6);
  uVar115 = (undefined2)(uVar12 >> 0x30);
  auVar242._8_4_ = 0;
  auVar242._0_8_ = uVar12;
  auVar242._12_2_ = uVar115;
  auVar242._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar12 >> 0x20);
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._8_2_ = 0;
  auVar241._0_8_ = uVar12;
  auVar241._10_2_ = uVar115;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._8_2_ = uVar115;
  auVar240._0_8_ = uVar12;
  uVar115 = (undefined2)(uVar12 >> 0x10);
  auVar43._4_8_ = auVar240._8_8_;
  auVar43._2_2_ = uVar115;
  auVar43._0_2_ = uVar115;
  uVar13 = *(ulong *)(prim + uVar59 * 0x12 + 6);
  uVar115 = (undefined2)(uVar13 >> 0x30);
  auVar91._8_4_ = 0;
  auVar91._0_8_ = uVar13;
  auVar91._12_2_ = uVar115;
  auVar91._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar13 >> 0x20);
  auVar90._12_4_ = auVar91._12_4_;
  auVar90._8_2_ = 0;
  auVar90._0_8_ = uVar13;
  auVar90._10_2_ = uVar115;
  auVar89._10_6_ = auVar90._10_6_;
  auVar89._8_2_ = uVar115;
  auVar89._0_8_ = uVar13;
  uVar115 = (undefined2)(uVar13 >> 0x10);
  auVar44._4_8_ = auVar89._8_8_;
  auVar44._2_2_ = uVar115;
  auVar44._0_2_ = uVar115;
  fVar169 = (float)(auVar44._0_4_ >> 0x10);
  fVar230 = (float)(auVar89._8_4_ >> 0x10);
  uVar68 = (ulong)(uint)((int)(uVar59 * 5) << 2);
  uVar14 = *(ulong *)(prim + uVar59 * 2 + uVar68 + 6);
  uVar115 = (undefined2)(uVar14 >> 0x30);
  auVar259._8_4_ = 0;
  auVar259._0_8_ = uVar14;
  auVar259._12_2_ = uVar115;
  auVar259._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar14 >> 0x20);
  auVar258._12_4_ = auVar259._12_4_;
  auVar258._8_2_ = 0;
  auVar258._0_8_ = uVar14;
  auVar258._10_2_ = uVar115;
  auVar257._10_6_ = auVar258._10_6_;
  auVar257._8_2_ = uVar115;
  auVar257._0_8_ = uVar14;
  uVar115 = (undefined2)(uVar14 >> 0x10);
  auVar45._4_8_ = auVar257._8_8_;
  auVar45._2_2_ = uVar115;
  auVar45._0_2_ = uVar115;
  uVar68 = *(ulong *)(prim + uVar68 + 6);
  uVar115 = (undefined2)(uVar68 >> 0x30);
  auVar94._8_4_ = 0;
  auVar94._0_8_ = uVar68;
  auVar94._12_2_ = uVar115;
  auVar94._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar68 >> 0x20);
  auVar93._12_4_ = auVar94._12_4_;
  auVar93._8_2_ = 0;
  auVar93._0_8_ = uVar68;
  auVar93._10_2_ = uVar115;
  auVar92._10_6_ = auVar93._10_6_;
  auVar92._8_2_ = uVar115;
  auVar92._0_8_ = uVar68;
  uVar115 = (undefined2)(uVar68 >> 0x10);
  auVar46._4_8_ = auVar92._8_8_;
  auVar46._2_2_ = uVar115;
  auVar46._0_2_ = uVar115;
  fVar171 = (float)(auVar46._0_4_ >> 0x10);
  fVar231 = (float)(auVar92._8_4_ >> 0x10);
  uVar15 = *(ulong *)(prim + uVar59 * 0x18 + 6);
  uVar115 = (undefined2)(uVar15 >> 0x30);
  auVar270._8_4_ = 0;
  auVar270._0_8_ = uVar15;
  auVar270._12_2_ = uVar115;
  auVar270._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar15 >> 0x20);
  auVar269._12_4_ = auVar270._12_4_;
  auVar269._8_2_ = 0;
  auVar269._0_8_ = uVar15;
  auVar269._10_2_ = uVar115;
  auVar268._10_6_ = auVar269._10_6_;
  auVar268._8_2_ = uVar115;
  auVar268._0_8_ = uVar15;
  uVar115 = (undefined2)(uVar15 >> 0x10);
  auVar47._4_8_ = auVar268._8_8_;
  auVar47._2_2_ = uVar115;
  auVar47._0_2_ = uVar115;
  uVar16 = *(ulong *)(prim + uVar59 * 0x1d + 6);
  uVar115 = (undefined2)(uVar16 >> 0x30);
  auVar97._8_4_ = 0;
  auVar97._0_8_ = uVar16;
  auVar97._12_2_ = uVar115;
  auVar97._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar16 >> 0x20);
  auVar96._12_4_ = auVar97._12_4_;
  auVar96._8_2_ = 0;
  auVar96._0_8_ = uVar16;
  auVar96._10_2_ = uVar115;
  auVar95._10_6_ = auVar96._10_6_;
  auVar95._8_2_ = uVar115;
  auVar95._0_8_ = uVar16;
  uVar115 = (undefined2)(uVar16 >> 0x10);
  auVar48._4_8_ = auVar95._8_8_;
  auVar48._2_2_ = uVar115;
  auVar48._0_2_ = uVar115;
  fVar188 = (float)(auVar48._0_4_ >> 0x10);
  fVar235 = (float)(auVar95._8_4_ >> 0x10);
  uVar17 = *(ulong *)(prim + uVar59 + (ulong)(byte)PVar21 * 0x20 + 6);
  uVar115 = (undefined2)(uVar17 >> 0x30);
  auVar287._8_4_ = 0;
  auVar287._0_8_ = uVar17;
  auVar287._12_2_ = uVar115;
  auVar287._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar17 >> 0x20);
  auVar286._12_4_ = auVar287._12_4_;
  auVar286._8_2_ = 0;
  auVar286._0_8_ = uVar17;
  auVar286._10_2_ = uVar115;
  auVar285._10_6_ = auVar286._10_6_;
  auVar285._8_2_ = uVar115;
  auVar285._0_8_ = uVar17;
  uVar115 = (undefined2)(uVar17 >> 0x10);
  auVar49._4_8_ = auVar285._8_8_;
  auVar49._2_2_ = uVar115;
  auVar49._0_2_ = uVar115;
  uVar18 = *(ulong *)(prim + ((ulong)(byte)PVar21 * 0x20 - uVar59) + 6);
  uVar115 = (undefined2)(uVar18 >> 0x30);
  auVar100._8_4_ = 0;
  auVar100._0_8_ = uVar18;
  auVar100._12_2_ = uVar115;
  auVar100._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar18 >> 0x20);
  auVar99._12_4_ = auVar100._12_4_;
  auVar99._8_2_ = 0;
  auVar99._0_8_ = uVar18;
  auVar99._10_2_ = uVar115;
  auVar98._10_6_ = auVar99._10_6_;
  auVar98._8_2_ = uVar115;
  auVar98._0_8_ = uVar18;
  uVar115 = (undefined2)(uVar18 >> 0x10);
  auVar50._4_8_ = auVar98._8_8_;
  auVar50._2_2_ = uVar115;
  auVar50._0_2_ = uVar115;
  fVar191 = (float)(auVar50._0_4_ >> 0x10);
  fVar236 = (float)(auVar98._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar59 * 0x23 + 6);
  uVar115 = (undefined2)(uVar59 >> 0x30);
  auVar297._8_4_ = 0;
  auVar297._0_8_ = uVar59;
  auVar297._12_2_ = uVar115;
  auVar297._14_2_ = uVar115;
  uVar115 = (undefined2)(uVar59 >> 0x20);
  auVar296._12_4_ = auVar297._12_4_;
  auVar296._8_2_ = 0;
  auVar296._0_8_ = uVar59;
  auVar296._10_2_ = uVar115;
  auVar295._10_6_ = auVar296._10_6_;
  auVar295._8_2_ = uVar115;
  auVar295._0_8_ = uVar59;
  uVar115 = (undefined2)(uVar59 >> 0x10);
  auVar51._4_8_ = auVar295._8_8_;
  auVar51._2_2_ = uVar115;
  auVar51._0_2_ = uVar115;
  auVar178._0_8_ =
       CONCAT44(((((float)(auVar41._0_4_ >> 0x10) - fVar156) * fVar275 + fVar156) - fVar311) *
                fVar117,((((float)(int)(short)uVar10 - (float)(int)(short)uVar64) * fVar275 +
                         (float)(int)(short)uVar64) - fVar306) * fVar170);
  auVar178._8_4_ =
       ((((float)(auVar175._8_4_ >> 0x10) - fVar206) * fVar275 + fVar206) - fVar312) * fVar196;
  auVar178._12_4_ =
       ((((float)(auVar176._12_4_ >> 0x10) - (float)(auVar84._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar84._12_4_ >> 0x10)) - fVar313) * fVar237;
  auVar243._0_4_ =
       ((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar275 +
        (float)(int)(short)uVar11) - fVar306) * fVar170;
  auVar243._4_4_ =
       ((((float)(auVar43._0_4_ >> 0x10) - fVar159) * fVar275 + fVar159) - fVar311) * fVar117;
  auVar243._8_4_ =
       ((((float)(auVar240._8_4_ >> 0x10) - fVar229) * fVar275 + fVar229) - fVar312) * fVar196;
  auVar243._12_4_ =
       ((((float)(auVar241._12_4_ >> 0x10) - (float)(auVar87._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar87._12_4_ >> 0x10)) - fVar313) * fVar237;
  auVar260._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar169) * fVar275 + fVar169) - fVar263) *
                fVar119,((((float)(int)(short)uVar14 - (float)(int)(short)uVar13) * fVar275 +
                         (float)(int)(short)uVar13) - fVar256) * fVar81);
  auVar260._8_4_ =
       ((((float)(auVar257._8_4_ >> 0x10) - fVar230) * fVar275 + fVar230) - fVar264) * fVar204;
  auVar260._12_4_ =
       ((((float)(auVar258._12_4_ >> 0x10) - (float)(auVar90._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar90._12_4_ >> 0x10)) - fVar305) * fVar245;
  auVar271._0_4_ =
       ((((float)(int)(short)uVar15 - (float)(int)(short)uVar68) * fVar275 +
        (float)(int)(short)uVar68) - fVar256) * fVar81;
  auVar271._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar171) * fVar275 + fVar171) - fVar263) * fVar119;
  auVar271._8_4_ =
       ((((float)(auVar268._8_4_ >> 0x10) - fVar231) * fVar275 + fVar231) - fVar264) * fVar204;
  auVar271._12_4_ =
       ((((float)(auVar269._12_4_ >> 0x10) - (float)(auVar93._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar93._12_4_ >> 0x10)) - fVar305) * fVar245;
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar288._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar188) * fVar275 + fVar188) - fVar254) *
                fVar154,((((float)(int)(short)uVar17 - (float)(int)(short)uVar16) * fVar275 +
                         (float)(int)(short)uVar16) - fVar252) * fVar116);
  auVar288._8_4_ =
       ((((float)(auVar285._8_4_ >> 0x10) - fVar235) * fVar275 + fVar235) - fVar255) * fVar205;
  auVar288._12_4_ =
       ((((float)(auVar286._12_4_ >> 0x10) - (float)(auVar96._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar96._12_4_ >> 0x10)) - fVar265) * fVar247;
  auVar298._0_4_ =
       ((((float)(int)(short)uVar59 - (float)(int)(short)uVar18) * fVar275 +
        (float)(int)(short)uVar18) - fVar252) * fVar116;
  auVar298._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar191) * fVar275 + fVar191) - fVar254) * fVar154;
  auVar298._8_4_ =
       ((((float)(auVar295._8_4_ >> 0x10) - fVar236) * fVar275 + fVar236) - fVar255) * fVar205;
  auVar298._12_4_ =
       ((((float)(auVar296._12_4_ >> 0x10) - (float)(auVar99._12_4_ >> 0x10)) * fVar275 +
        (float)(auVar99._12_4_ >> 0x10)) - fVar265) * fVar247;
  auVar160._8_4_ = auVar178._8_4_;
  auVar160._0_8_ = auVar178._0_8_;
  auVar160._12_4_ = auVar178._12_4_;
  auVar161 = minps(auVar160,auVar243);
  auVar130._8_4_ = auVar260._8_4_;
  auVar130._0_8_ = auVar260._0_8_;
  auVar130._12_4_ = auVar260._12_4_;
  auVar82 = minps(auVar130,auVar271);
  auVar161 = maxps(auVar161,auVar82);
  auVar131._8_4_ = auVar288._8_4_;
  auVar131._0_8_ = auVar288._0_8_;
  auVar131._12_4_ = auVar288._12_4_;
  auVar82 = minps(auVar131,auVar298);
  auVar101._4_4_ = uVar58;
  auVar101._0_4_ = uVar58;
  auVar101._8_4_ = uVar58;
  auVar101._12_4_ = uVar58;
  auVar82 = maxps(auVar82,auVar101);
  auVar82 = maxps(auVar161,auVar82);
  auVar161 = maxps(auVar178,auVar243);
  auVar261 = maxps(auVar260,auVar271);
  auVar161 = minps(auVar161,auVar261);
  local_48 = auVar82._0_4_ * 0.99999964;
  fStack_44 = auVar82._4_4_ * 0.99999964;
  fStack_40 = auVar82._8_4_ * 0.99999964;
  fStack_3c = auVar82._12_4_ * 0.99999964;
  auVar82 = maxps(auVar288,auVar298);
  uVar58 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar102._4_4_ = uVar58;
  auVar102._0_4_ = uVar58;
  auVar102._8_4_ = uVar58;
  auVar102._12_4_ = uVar58;
  auVar82 = minps(auVar82,auVar102);
  auVar82 = minps(auVar161,auVar82);
  uVar72 = (uint)(byte)PVar21;
  auVar132._0_4_ = -(uint)(uVar72 != 0 && local_48 <= auVar82._0_4_ * 1.0000004);
  auVar132._4_4_ = -(uint)(1 < uVar72 && fStack_44 <= auVar82._4_4_ * 1.0000004);
  auVar132._8_4_ = -(uint)(2 < uVar72 && fStack_40 <= auVar82._8_4_ * 1.0000004);
  auVar132._12_4_ = -(uint)(3 < uVar72 && fStack_3c <= auVar82._12_4_ * 1.0000004);
  uVar72 = movmskps(uVar72,auVar132);
  if (uVar72 != 0) {
    uVar72 = uVar72 & 0xff;
    local_210 = pre->ray_space + k;
    local_3c8 = mm_lookupmask_ps._0_8_;
    uStack_3c0 = mm_lookupmask_ps._8_8_;
    local_2c8 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
    local_3e8 = prim;
    local_3e0 = pre;
    local_2c0 = ray;
    do {
      lVar26 = 0;
      if (uVar72 != 0) {
        for (; (uVar72 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
        }
      }
      uVar73 = *(uint *)(prim + 2);
      pRVar66 = (RTCIntersectArguments *)(ulong)uVar73;
      uVar75 = *(uint *)(prim + lVar26 * 4 + 6);
      pGVar23 = (context->scene->geometries).items[(long)pRVar66].ptr;
      uVar64 = (ulong)*(uint *)(*(long *)&pGVar23->field_0x58 +
                               (ulong)uVar75 *
                               pGVar23[1].super_RefCount.refCounter.
                               super___atomic_base<unsigned_long>._M_i);
      fVar170 = pGVar23->fnumTimeSegments;
      fVar81 = (pGVar23->time_range).lower;
      fVar116 = ((*(float *)(ray + k * 4 + 0x70) - fVar81) / ((pGVar23->time_range).upper - fVar81))
                * fVar170;
      fVar81 = floorf(fVar116);
      fVar170 = fVar170 + -1.0;
      if (fVar170 <= fVar81) {
        fVar81 = fVar170;
      }
      fVar170 = 0.0;
      if (0.0 <= fVar81) {
        fVar170 = fVar81;
      }
      _Var24 = pGVar23[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      lVar60 = (long)(int)fVar170 * 0x38;
      lVar70 = *(long *)(_Var24 + 0x10 + lVar60);
      lVar71 = *(long *)(_Var24 + 0x38 + lVar60);
      lVar25 = *(long *)(_Var24 + 0x48 + lVar60);
      pfVar1 = (float *)(lVar71 + lVar25 * uVar64);
      lVar26 = uVar64 + 1;
      pfVar2 = (float *)(lVar71 + lVar25 * lVar26);
      p_Var61 = pGVar23[4].occlusionFilterN;
      pfVar3 = (float *)(*(long *)(_Var24 + lVar60) + lVar70 * uVar64);
      pfVar4 = (float *)(*(long *)(_Var24 + lVar60) + lVar70 * lVar26);
      pfVar5 = (float *)(*(long *)(p_Var61 + lVar60 + 0x38) +
                        uVar64 * *(long *)(p_Var61 + lVar60 + 0x48));
      fVar116 = fVar116 - fVar170;
      fVar119 = 1.0 - fVar116;
      pGVar69 = (Geometry *)(*(long *)(p_Var61 + lVar60 + 0x48) * lVar26);
      pfVar6 = (float *)((long)&(pGVar69->super_RefCount)._vptr_RefCount +
                        *(long *)(p_Var61 + lVar60 + 0x38));
      fVar196 = *pfVar3 * fVar119 + *pfVar1 * fVar116;
      fVar205 = pfVar3[1] * fVar119 + pfVar1[1] * fVar116;
      fVar229 = pfVar3[2] * fVar119 + pfVar1[2] * fVar116;
      fVar231 = pfVar3[3] * fVar119 + pfVar1[3] * fVar116;
      pfVar1 = (float *)(*(long *)(p_Var61 + lVar60) + *(long *)(p_Var61 + lVar60 + 0x10) * uVar64);
      local_398 = *pfVar4 * fVar119 + *pfVar2 * fVar116;
      fStack_394 = pfVar4[1] * fVar119 + pfVar2[1] * fVar116;
      fStack_390 = pfVar4[2] * fVar119 + pfVar2[2] * fVar116;
      fStack_38c = pfVar4[3] * fVar119 + pfVar2[3] * fVar116;
      pfVar2 = (float *)(*(long *)(p_Var61 + lVar60) + *(long *)(p_Var61 + lVar60 + 0x10) * lVar26);
      iVar22 = (int)pGVar23[6].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
      fVar170 = *(float *)(ray + k * 4);
      fVar81 = *(float *)(ray + k * 4 + 0x10);
      fVar117 = *(float *)(ray + k * 4 + 0x20);
      local_3a8 = (*pfVar1 * fVar119 + *pfVar5 * fVar116) * 0.33333334 + fVar196;
      fStack_3a4 = (pfVar1[1] * fVar119 + pfVar5[1] * fVar116) * 0.33333334 + fVar205;
      fStack_3a0 = (pfVar1[2] * fVar119 + pfVar5[2] * fVar116) * 0.33333334 + fVar229;
      fStack_39c = (pfVar1[3] * fVar119 + pfVar5[3] * fVar116) * 0.33333334 + fVar231;
      local_3b8 = local_398 - (fVar119 * *pfVar2 + fVar116 * *pfVar6) * 0.33333334;
      fStack_3b4 = fStack_394 - (fVar119 * pfVar2[1] + fVar116 * pfVar6[1]) * 0.33333334;
      fStack_3b0 = fStack_390 - (fVar119 * pfVar2[2] + fVar116 * pfVar6[2]) * 0.33333334;
      fStack_3ac = fStack_38c - (fVar119 * pfVar2[3] + fVar116 * pfVar6[3]) * 0.33333334;
      fVar204 = fVar196 - fVar170;
      fVar206 = fVar205 - fVar81;
      fVar230 = fVar229 - fVar117;
      fVar116 = (local_210->vx).field_0.m128[0];
      fVar119 = (local_210->vx).field_0.m128[1];
      fVar154 = (local_210->vx).field_0.m128[2];
      fVar156 = (local_210->vy).field_0.m128[0];
      fVar159 = (local_210->vy).field_0.m128[1];
      fVar169 = (local_210->vy).field_0.m128[2];
      fVar171 = (local_210->vz).field_0.m128[0];
      fVar188 = (local_210->vz).field_0.m128[1];
      fVar191 = (local_210->vz).field_0.m128[2];
      local_238 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      local_2a8 = fVar204 * fVar119 + fVar206 * fVar159 + fVar230 * fVar188;
      fVar237 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar204 = local_3a8 - fVar170;
      fVar206 = fStack_3a4 - fVar81;
      fVar230 = fStack_3a0 - fVar117;
      fVar235 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      fVar236 = fVar204 * fVar119 + fVar206 * fVar159 + fVar230 * fVar188;
      fVar245 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar204 = local_3b8 - fVar170;
      fVar206 = fStack_3b4 - fVar81;
      fVar230 = fStack_3b0 - fVar117;
      local_2d8 = fVar204 * fVar116 + fVar206 * fVar156 + fVar230 * fVar171;
      local_2e8 = fVar204 * fVar119 + fVar206 * fVar159 + fVar230 * fVar188;
      local_2f8 = fVar204 * fVar154 + fVar206 * fVar169 + fVar230 * fVar191;
      fVar170 = local_398 - fVar170;
      fVar81 = fStack_394 - fVar81;
      fVar117 = fStack_390 - fVar117;
      fVar116 = fVar170 * fVar116 + fVar81 * fVar156 + fVar117 * fVar171;
      fVar119 = fVar170 * fVar119 + fVar81 * fVar159 + fVar117 * fVar188;
      local_298 = fVar170 * fVar154 + fVar81 * fVar169 + fVar117 * fVar191;
      auVar272._0_8_ = CONCAT44(local_2a8,local_238) & 0x7fffffff7fffffff;
      auVar272._8_4_ = ABS(fVar237);
      auVar272._12_4_ = ABS(fVar231);
      auVar197._0_8_ = CONCAT44(fVar236,fVar235) & 0x7fffffff7fffffff;
      auVar197._8_4_ = ABS(fVar245);
      auVar197._12_4_ = ABS(fStack_39c);
      auVar161 = maxps(auVar272,auVar197);
      auVar223._0_8_ = CONCAT44(local_2e8,local_2d8) & 0x7fffffff7fffffff;
      auVar223._8_4_ = ABS(local_2f8);
      auVar223._12_4_ = ABS(fStack_3ac);
      auVar133._0_8_ = CONCAT44(fVar119,fVar116) & 0x7fffffff7fffffff;
      auVar133._8_4_ = ABS(local_298);
      auVar133._12_4_ = ABS(fStack_38c);
      auVar82 = maxps(auVar223,auVar133);
      auVar82 = maxps(auVar161,auVar82);
      uVar118 = auVar82._8_8_;
      fVar170 = auVar82._4_4_;
      if (auVar82._4_4_ <= auVar82._0_4_) {
        fVar170 = auVar82._0_4_;
      }
      auVar273._8_8_ = uVar118;
      auVar273._0_8_ = uVar118;
      fVar81 = (float)iVar22;
      _local_2b8 = ZEXT416((uint)fVar81);
      if (auVar82._8_4_ <= fVar170) {
        auVar274._4_12_ = auVar273._4_12_;
        auVar274._0_4_ = fVar170;
        uVar118 = auVar274._0_8_;
      }
      iVar65 = iVar22 * 0x40;
      lVar26 = (long)iVar22 * 0x44;
      fVar117 = *(float *)(bezier_basis0 + lVar26 + 0x908);
      fVar154 = *(float *)(bezier_basis0 + lVar26 + 0x90c);
      fVar156 = *(float *)(bezier_basis0 + lVar26 + 0x910);
      fVar159 = *(float *)(bezier_basis0 + lVar26 + 0x914);
      fVar169 = *(float *)(bezier_basis0 + lVar26 + 0xd8c);
      fVar171 = *(float *)(bezier_basis0 + lVar26 + 0xd90);
      fVar188 = *(float *)(bezier_basis0 + lVar26 + 0xd94);
      fVar191 = *(float *)(bezier_basis0 + lVar26 + 0xd98);
      fVar204 = *(float *)(bezier_basis0 + lVar26 + 0x484);
      fVar206 = *(float *)(bezier_basis0 + lVar26 + 0x488);
      fVar230 = *(float *)(bezier_basis0 + lVar26 + 0x48c);
      fVar247 = *(float *)(bezier_basis0 + lVar26 + 0x490);
      local_268 = *(float *)(bezier_basis0 + lVar26);
      fStack_264 = *(float *)(bezier_basis0 + lVar26 + 4);
      fStack_260 = *(float *)(bezier_basis0 + lVar26 + 8);
      fStack_25c = *(float *)(bezier_basis0 + lVar26 + 0xc);
      local_318 = local_238 * local_268 +
                  fVar235 * fVar204 + local_2d8 * fVar117 + fVar116 * fVar169;
      fStack_314 = local_238 * fStack_264 +
                   fVar235 * fVar206 + local_2d8 * fVar154 + fVar116 * fVar171;
      fStack_310 = local_238 * fStack_260 +
                   fVar235 * fVar230 + local_2d8 * fVar156 + fVar116 * fVar188;
      fStack_30c = local_238 * fStack_25c +
                   fVar235 * fVar247 + local_2d8 * fVar159 + fVar116 * fVar191;
      local_258 = local_2a8 * local_268 +
                  fVar236 * fVar204 + local_2e8 * fVar117 + fVar119 * fVar169;
      fStack_254 = local_2a8 * fStack_264 +
                   fVar236 * fVar206 + local_2e8 * fVar154 + fVar119 * fVar171;
      fStack_250 = local_2a8 * fStack_260 +
                   fVar236 * fVar230 + local_2e8 * fVar156 + fVar119 * fVar188;
      fStack_24c = local_2a8 * fStack_25c +
                   fVar236 * fVar247 + local_2e8 * fVar159 + fVar119 * fVar191;
      auVar299._0_4_ =
           fVar231 * local_268 + fStack_39c * fVar204 + fStack_3ac * fVar117 + fStack_38c * fVar169;
      auVar299._4_4_ =
           fVar231 * fStack_264 + fStack_39c * fVar206 + fStack_3ac * fVar154 + fStack_38c * fVar171
      ;
      auVar299._8_4_ =
           fVar231 * fStack_260 + fStack_39c * fVar230 + fStack_3ac * fVar156 + fStack_38c * fVar188
      ;
      auVar299._12_4_ =
           fVar231 * fStack_25c + fStack_39c * fVar247 + fStack_3ac * fVar159 + fStack_38c * fVar191
      ;
      fVar170 = *(float *)*(undefined1 (*) [12])(bezier_basis1 + lVar26 + 0xd8c);
      fVar256 = *(float *)(bezier_basis1 + lVar26 + 0xd90);
      fVar263 = *(float *)(bezier_basis1 + lVar26 + 0xd94);
      auVar31 = *(undefined1 (*) [12])(bezier_basis1 + lVar26 + 0xd8c);
      fVar264 = *(float *)(bezier_basis1 + lVar26 + 0xd98);
      pauVar8 = (undefined1 (*) [16])(bezier_basis1 + lVar26 + 0x908);
      fVar305 = *(float *)*pauVar8;
      fVar252 = *(float *)(bezier_basis1 + lVar26 + 0x90c);
      fVar254 = *(float *)(bezier_basis1 + lVar26 + 0x910);
      auVar32 = *(undefined1 (*) [12])*pauVar8;
      fVar255 = *(float *)(bezier_basis1 + lVar26 + 0x914);
      _local_278 = *pauVar8;
      local_128 = fStack_38c;
      fStack_124 = fStack_38c;
      fStack_120 = fStack_38c;
      fStack_11c = fStack_38c;
      fVar265 = *(float *)(bezier_basis1 + lVar26 + 0x484);
      fVar275 = *(float *)(bezier_basis1 + lVar26 + 0x488);
      fVar278 = *(float *)(bezier_basis1 + lVar26 + 0x48c);
      fVar283 = *(float *)(bezier_basis1 + lVar26 + 0x490);
      local_138 = fStack_39c;
      fStack_134 = fStack_39c;
      fStack_130 = fStack_39c;
      fStack_12c = fStack_39c;
      fVar290 = *(float *)(bezier_basis1 + lVar26);
      fVar291 = *(float *)(bezier_basis1 + lVar26 + 4);
      fVar292 = *(float *)(bezier_basis1 + lVar26 + 8);
      fVar293 = *(float *)(bezier_basis1 + lVar26 + 0xc);
      local_248 = local_238 * fVar290 + fVar235 * fVar265 + local_2d8 * fVar305 + fVar116 * fVar170;
      fStack_244 = local_238 * fVar291 + fVar235 * fVar275 + local_2d8 * fVar252 + fVar116 * fVar256
      ;
      fStack_240 = local_238 * fVar292 + fVar235 * fVar278 + local_2d8 * fVar254 + fVar116 * fVar263
      ;
      fStack_23c = local_238 * fVar293 + fVar235 * fVar283 + local_2d8 * fVar255 + fVar116 * fVar264
      ;
      fVar302 = local_2a8 * fVar290 + fVar236 * fVar265 + local_2e8 * fVar305 + fVar119 * fVar170;
      fVar303 = local_2a8 * fVar291 + fVar236 * fVar275 + local_2e8 * fVar252 + fVar119 * fVar256;
      fVar304 = local_2a8 * fVar292 + fVar236 * fVar278 + local_2e8 * fVar254 + fVar119 * fVar263;
      fVar306 = local_2a8 * fVar293 + fVar236 * fVar283 + local_2e8 * fVar255 + fVar119 * fVar264;
      local_148 = fVar231;
      fStack_144 = fVar231;
      fStack_140 = fVar231;
      fStack_13c = fVar231;
      auVar224._0_4_ =
           fVar231 * fVar290 + fStack_39c * fVar265 + fStack_3ac * fVar305 + fStack_38c * fVar170;
      auVar224._4_4_ =
           fVar231 * fVar291 + fStack_39c * fVar275 + fStack_3ac * fVar252 + fStack_38c * fVar256;
      auVar224._8_4_ =
           fVar231 * fVar292 + fStack_39c * fVar278 + fStack_3ac * fVar254 + fStack_38c * fVar263;
      auVar224._12_4_ =
           fVar231 * fVar293 + fStack_39c * fVar283 + fStack_3ac * fVar255 + fStack_38c * fVar264;
      local_328 = local_248 - local_318;
      fStack_324 = fStack_244 - fStack_314;
      fStack_320 = fStack_240 - fStack_310;
      fStack_31c = fStack_23c - fStack_30c;
      fVar256 = fVar302 - local_258;
      fVar263 = fVar303 - fStack_254;
      fVar305 = fVar304 - fStack_250;
      fVar252 = fVar306 - fStack_24c;
      fVar170 = local_258 * local_328 - local_318 * fVar256;
      fVar254 = fStack_254 * fStack_324 - fStack_314 * fVar263;
      fVar311 = fStack_250 * fStack_320 - fStack_310 * fVar305;
      fVar312 = fStack_24c * fStack_31c - fStack_30c * fVar252;
      auVar82 = maxps(auVar299,auVar224);
      bVar54 = fVar170 * fVar170 <=
               auVar82._0_4_ * auVar82._0_4_ * (local_328 * local_328 + fVar256 * fVar256) &&
               0.0 < fVar81;
      local_308 = (float)-(uint)bVar54;
      bVar55 = fVar254 * fVar254 <=
               auVar82._4_4_ * auVar82._4_4_ * (fStack_324 * fStack_324 + fVar263 * fVar263) &&
               1.0 < fVar81;
      fStack_304 = (float)-(uint)bVar55;
      bVar53 = fVar311 * fVar311 <=
               auVar82._8_4_ * auVar82._8_4_ * (fStack_320 * fStack_320 + fVar305 * fVar305) &&
               2.0 < fVar81;
      fStack_300 = (float)-(uint)bVar53;
      bVar52 = 3.0 < fVar81 &&
               fVar312 * fVar312 <=
               auVar82._12_4_ * auVar82._12_4_ * (fStack_31c * fStack_31c + fVar252 * fVar252);
      fStack_2fc = (float)-(uint)bVar52;
      local_458 = (float)uVar118;
      local_458 = local_458 * 4.7683716e-07;
      auVar27._4_4_ = fStack_304;
      auVar27._0_4_ = local_308;
      auVar27._8_4_ = fStack_300;
      auVar27._12_4_ = fStack_2fc;
      iVar57 = movmskps(iVar22,auVar27);
      fVar170 = *(float *)(ray + k * 4 + 0x30);
      _local_388 = ZEXT416((uint)fVar170);
      fStack_2f4 = local_2f8;
      fStack_2f0 = local_2f8;
      fStack_2ec = local_2f8;
      fStack_2e4 = local_2e8;
      fStack_2e0 = local_2e8;
      fStack_2dc = local_2e8;
      fStack_2d4 = local_2d8;
      fStack_2d0 = local_2d8;
      fStack_2cc = local_2d8;
      fStack_2a4 = local_2a8;
      fStack_2a0 = local_2a8;
      fStack_29c = local_2a8;
      fStack_294 = local_298;
      fStack_290 = local_298;
      fStack_28c = local_298;
      fStack_234 = local_238;
      fStack_230 = local_238;
      fStack_22c = local_238;
      local_228 = fStack_3ac;
      fStack_224 = fStack_3ac;
      fStack_220 = fStack_3ac;
      fStack_21c = fStack_3ac;
      if (iVar57 != 0) {
        local_278._0_4_ = auVar32._0_4_;
        local_278._4_4_ = auVar32._4_4_;
        fStack_270 = auVar32._8_4_;
        local_518._0_4_ = auVar31._0_4_;
        local_518._4_4_ = auVar31._4_4_;
        fStack_510 = auVar31._8_4_;
        fVar172 = (float)local_518._0_4_ * local_298 + (float)local_278._0_4_ * local_2f8 +
                  fVar265 * fVar245 + fVar290 * fVar237;
        fVar189 = (float)local_518._4_4_ * local_298 + (float)local_278._4_4_ * local_2f8 +
                  fVar275 * fVar245 + fVar291 * fVar237;
        fVar192 = fStack_510 * local_298 + fStack_270 * local_2f8 + fVar278 * fVar245 +
                  fVar292 * fVar237;
        fVar194 = fVar264 * local_298 + fVar255 * local_2f8 + fVar283 * fVar245 + fVar293 * fVar237;
        fVar173 = fVar169 * local_298 + fVar117 * local_2f8 + fVar204 * fVar245 +
                  local_268 * fVar237;
        fVar190 = fVar171 * local_298 + fVar154 * local_2f8 + fVar206 * fVar245 +
                  fStack_264 * fVar237;
        fVar193 = fVar188 * local_298 + fVar156 * local_2f8 + fVar230 * fVar245 +
                  fStack_260 * fVar237;
        fVar195 = fVar191 * local_298 + fVar159 * local_2f8 + fVar247 * fVar245 +
                  fStack_25c * fVar237;
        fVar117 = *(float *)(bezier_basis0 + lVar26 + 0x1210);
        fVar154 = *(float *)(bezier_basis0 + lVar26 + 0x1214);
        fVar156 = *(float *)(bezier_basis0 + lVar26 + 0x1218);
        fVar159 = *(float *)(bezier_basis0 + lVar26 + 0x121c);
        fVar169 = *(float *)(bezier_basis0 + lVar26 + 0x1694);
        fVar171 = *(float *)(bezier_basis0 + lVar26 + 0x1698);
        fVar188 = *(float *)(bezier_basis0 + lVar26 + 0x169c);
        fVar191 = *(float *)(bezier_basis0 + lVar26 + 0x16a0);
        fVar204 = *(float *)(bezier_basis0 + lVar26 + 0x1b18);
        fVar206 = *(float *)(bezier_basis0 + lVar26 + 0x1b1c);
        fVar230 = *(float *)(bezier_basis0 + lVar26 + 0x1b20);
        fVar247 = *(float *)(bezier_basis0 + lVar26 + 0x1b24);
        fVar264 = *(float *)(bezier_basis0 + lVar26 + 0x1f9c);
        fVar254 = *(float *)(bezier_basis0 + lVar26 + 0x1fa0);
        fVar255 = *(float *)(bezier_basis0 + lVar26 + 0x1fa4);
        fVar265 = *(float *)(bezier_basis0 + lVar26 + 0x1fa8);
        fVar266 = local_238 * fVar117 + fVar235 * fVar169 + local_2d8 * fVar204 + fVar116 * fVar264;
        fVar276 = local_238 * fVar154 + fVar235 * fVar171 + local_2d8 * fVar206 + fVar116 * fVar254;
        fVar279 = local_238 * fVar156 + fVar235 * fVar188 + local_2d8 * fVar230 + fVar116 * fVar255;
        fVar281 = local_238 * fVar159 + fVar235 * fVar191 + local_2d8 * fVar247 + fVar116 * fVar265;
        fVar317 = local_2a8 * fVar117 + fVar236 * fVar169 + local_2e8 * fVar204 + fVar119 * fVar264;
        fVar318 = local_2a8 * fVar154 + fVar236 * fVar171 + local_2e8 * fVar206 + fVar119 * fVar254;
        fVar319 = local_2a8 * fVar156 + fVar236 * fVar188 + local_2e8 * fVar230 + fVar119 * fVar255;
        fVar321 = local_2a8 * fVar159 + fVar236 * fVar191 + local_2e8 * fVar247 + fVar119 * fVar265;
        fVar275 = *(float *)(bezier_basis1 + lVar26 + 0x1210);
        fVar278 = *(float *)(bezier_basis1 + lVar26 + 0x1214);
        fVar283 = *(float *)(bezier_basis1 + lVar26 + 0x1218);
        fVar290 = *(float *)(bezier_basis1 + lVar26 + 0x121c);
        fVar291 = *(float *)(bezier_basis1 + lVar26 + 0x1b18);
        fVar292 = *(float *)(bezier_basis1 + lVar26 + 0x1b1c);
        fVar293 = *(float *)(bezier_basis1 + lVar26 + 0x1b20);
        fVar311 = *(float *)(bezier_basis1 + lVar26 + 0x1b24);
        fVar312 = *(float *)(bezier_basis1 + lVar26 + 0x1f9c);
        fVar313 = *(float *)(bezier_basis1 + lVar26 + 0x1fa0);
        fVar249 = *(float *)(bezier_basis1 + lVar26 + 0x1fa4);
        fVar251 = *(float *)(bezier_basis1 + lVar26 + 0x1fa8);
        fVar267 = *(float *)(bezier_basis1 + lVar26 + 0x1694);
        fVar277 = *(float *)(bezier_basis1 + lVar26 + 0x1698);
        fVar280 = *(float *)(bezier_basis1 + lVar26 + 0x169c);
        fVar282 = *(float *)(bezier_basis1 + lVar26 + 0x16a0);
        fVar238 = local_238 * fVar275 + fVar235 * fVar267 + local_2d8 * fVar291 + fVar116 * fVar312;
        fVar246 = local_238 * fVar278 + fVar235 * fVar277 + local_2d8 * fVar292 + fVar116 * fVar313;
        fVar248 = local_238 * fVar283 + fVar235 * fVar280 + local_2d8 * fVar293 + fVar116 * fVar249;
        fVar250 = local_238 * fVar290 + fVar235 * fVar282 + local_2d8 * fVar311 + fVar116 * fVar251;
        fVar120 = local_2a8 * fVar275 + fVar236 * fVar267 + local_2e8 * fVar291 + fVar119 * fVar312;
        fVar155 = local_2a8 * fVar278 + fVar236 * fVar277 + local_2e8 * fVar292 + fVar119 * fVar313;
        fVar157 = local_2a8 * fVar283 + fVar236 * fVar280 + local_2e8 * fVar293 + fVar119 * fVar249;
        fVar158 = local_2a8 * fVar290 + fVar236 * fVar282 + local_2e8 * fVar311 + fVar119 * fVar251;
        auVar300._0_8_ = CONCAT44(fVar276,fVar266) & 0x7fffffff7fffffff;
        auVar300._8_4_ = ABS(fVar279);
        auVar300._12_4_ = ABS(fVar281);
        auVar253._0_8_ = CONCAT44(fVar318,fVar317) & 0x7fffffff7fffffff;
        auVar253._8_4_ = ABS(fVar319);
        auVar253._12_4_ = ABS(fVar321);
        auVar82 = maxps(auVar300,auVar253);
        auVar307._0_8_ =
             CONCAT44(fVar154 * fVar237 +
                      fVar171 * fVar245 + fVar206 * local_2f8 + fVar254 * local_298,
                      fVar117 * fVar237 +
                      fVar169 * fVar245 + fVar204 * local_2f8 + fVar264 * local_298) &
             0x7fffffff7fffffff;
        auVar307._8_4_ =
             ABS(fVar156 * fVar237 + fVar188 * fVar245 + fVar230 * local_2f8 + fVar255 * local_298);
        auVar307._12_4_ =
             ABS(fVar159 * fVar237 + fVar191 * fVar245 + fVar247 * local_2f8 + fVar265 * local_298);
        auVar82 = maxps(auVar82,auVar307);
        uVar77 = -(uint)(local_458 <= auVar82._0_4_);
        uVar74 = -(uint)(local_458 <= auVar82._4_4_);
        uVar76 = -(uint)(local_458 <= auVar82._8_4_);
        uVar78 = -(uint)(local_458 <= auVar82._12_4_);
        auVar29._4_4_ = fStack_324;
        auVar29._0_4_ = local_328;
        auVar29._8_4_ = fStack_320;
        auVar29._12_4_ = fStack_31c;
        fVar171 = (float)((uint)fVar266 & uVar77 | ~uVar77 & (uint)local_328);
        fVar191 = (float)((uint)fVar276 & uVar74 | ~uVar74 & (uint)fStack_324);
        fVar247 = (float)((uint)fVar279 & uVar76 | ~uVar76 & (uint)fStack_320);
        fVar264 = (float)((uint)fVar281 & uVar78 | ~uVar78 & (uint)fStack_31c);
        fVar254 = (float)(~uVar77 & (uint)fVar256 | (uint)fVar317 & uVar77);
        fVar255 = (float)(~uVar74 & (uint)fVar263 | (uint)fVar318 & uVar74);
        fVar265 = (float)(~uVar76 & (uint)fVar305 | (uint)fVar319 & uVar76);
        fVar266 = (float)(~uVar78 & (uint)fVar252 | (uint)fVar321 & uVar78);
        auVar308._0_8_ = CONCAT44(fVar246,fVar238) & 0x7fffffff7fffffff;
        auVar308._8_4_ = ABS(fVar248);
        auVar308._12_4_ = ABS(fVar250);
        auVar262._0_8_ = CONCAT44(fVar155,fVar120) & 0x7fffffff7fffffff;
        auVar262._8_4_ = ABS(fVar157);
        auVar262._12_4_ = ABS(fVar158);
        auVar82 = maxps(auVar308,auVar262);
        auVar233._0_8_ =
             CONCAT44(fVar278 * fVar237 +
                      fVar277 * fVar245 + fVar292 * local_2f8 + fVar313 * local_298,
                      fVar275 * fVar237 +
                      fVar267 * fVar245 + fVar291 * local_2f8 + fVar312 * local_298) &
             0x7fffffff7fffffff;
        auVar233._8_4_ =
             ABS(fVar283 * fVar237 + fVar280 * fVar245 + fVar293 * local_2f8 + fVar249 * local_298);
        auVar233._12_4_ =
             ABS(fVar290 * fVar237 + fVar282 * fVar245 + fVar311 * local_2f8 + fVar251 * local_298);
        auVar82 = maxps(auVar82,auVar233);
        uVar77 = -(uint)(local_458 <= auVar82._0_4_);
        uVar74 = -(uint)(local_458 <= auVar82._4_4_);
        uVar76 = -(uint)(local_458 <= auVar82._8_4_);
        uVar78 = -(uint)(local_458 <= auVar82._12_4_);
        fVar169 = (float)((uint)fVar238 & uVar77 | ~uVar77 & (uint)local_328);
        fVar188 = (float)((uint)fVar246 & uVar74 | ~uVar74 & (uint)fStack_324);
        fVar204 = (float)((uint)fVar248 & uVar76 | ~uVar76 & (uint)fStack_320);
        fVar206 = (float)((uint)fVar250 & uVar78 | ~uVar78 & (uint)fStack_31c);
        fVar275 = (float)(~uVar77 & (uint)fVar256 | (uint)fVar120 & uVar77);
        fVar263 = (float)(~uVar74 & (uint)fVar263 | (uint)fVar155 & uVar74);
        fVar305 = (float)(~uVar76 & (uint)fVar305 | (uint)fVar157 & uVar76);
        fVar252 = (float)(~uVar78 & (uint)fVar252 | (uint)fVar158 & uVar78);
        auVar134._0_4_ = fVar254 * fVar254 + fVar171 * fVar171;
        auVar134._4_4_ = fVar255 * fVar255 + fVar191 * fVar191;
        auVar134._8_4_ = fVar265 * fVar265 + fVar247 * fVar247;
        auVar134._12_4_ = fVar266 * fVar266 + fVar264 * fVar264;
        auVar82 = rsqrtps(auVar29,auVar134);
        fVar117 = auVar82._0_4_;
        fVar154 = auVar82._4_4_;
        fVar156 = auVar82._8_4_;
        fVar159 = auVar82._12_4_;
        auVar198._0_4_ = fVar117 * fVar117 * auVar134._0_4_ * 0.5 * fVar117;
        auVar198._4_4_ = fVar154 * fVar154 * auVar134._4_4_ * 0.5 * fVar154;
        auVar198._8_4_ = fVar156 * fVar156 * auVar134._8_4_ * 0.5 * fVar156;
        auVar198._12_4_ = fVar159 * fVar159 * auVar134._12_4_ * 0.5 * fVar159;
        fVar278 = fVar117 * 1.5 - auVar198._0_4_;
        fVar283 = fVar154 * 1.5 - auVar198._4_4_;
        fVar290 = fVar156 * 1.5 - auVar198._8_4_;
        fVar312 = fVar159 * 1.5 - auVar198._12_4_;
        auVar135._0_4_ = fVar275 * fVar275 + fVar169 * fVar169;
        auVar135._4_4_ = fVar263 * fVar263 + fVar188 * fVar188;
        auVar135._8_4_ = fVar305 * fVar305 + fVar204 * fVar204;
        auVar135._12_4_ = fVar252 * fVar252 + fVar206 * fVar206;
        auVar82 = rsqrtps(auVar198,auVar135);
        fVar117 = auVar82._0_4_;
        fVar154 = auVar82._4_4_;
        fVar156 = auVar82._8_4_;
        fVar159 = auVar82._12_4_;
        fVar117 = fVar117 * 1.5 - fVar117 * fVar117 * auVar135._0_4_ * 0.5 * fVar117;
        fVar230 = fVar154 * 1.5 - fVar154 * fVar154 * auVar135._4_4_ * 0.5 * fVar154;
        fVar156 = fVar156 * 1.5 - fVar156 * fVar156 * auVar135._8_4_ * 0.5 * fVar156;
        fVar256 = fVar159 * 1.5 - fVar159 * fVar159 * auVar135._12_4_ * 0.5 * fVar159;
        fVar291 = fVar254 * fVar278 * auVar299._0_4_;
        fVar292 = fVar255 * fVar283 * auVar299._4_4_;
        fVar293 = fVar265 * fVar290 * auVar299._8_4_;
        fVar311 = fVar266 * fVar312 * auVar299._12_4_;
        fVar154 = -fVar171 * fVar278 * auVar299._0_4_;
        fVar159 = -fVar191 * fVar283 * auVar299._4_4_;
        fVar171 = -fVar247 * fVar290 * auVar299._8_4_;
        fVar191 = -fVar264 * fVar312 * auVar299._12_4_;
        fVar266 = fVar278 * 0.0 * auVar299._0_4_;
        fVar276 = fVar283 * 0.0 * auVar299._4_4_;
        fVar279 = fVar290 * 0.0 * auVar299._8_4_;
        fVar281 = fVar312 * 0.0 * auVar299._12_4_;
        fVar120 = fVar275 * fVar117 * auVar224._0_4_;
        fVar155 = fVar263 * fVar230 * auVar224._4_4_;
        fVar157 = fVar305 * fVar156 * auVar224._8_4_;
        fVar158 = fVar252 * fVar256 * auVar224._12_4_;
        fVar312 = local_248 + fVar120;
        fVar313 = fStack_244 + fVar155;
        fVar249 = fStack_240 + fVar157;
        fVar251 = fStack_23c + fVar158;
        fVar254 = -fVar169 * fVar117 * auVar224._0_4_;
        fVar265 = -fVar188 * fVar230 * auVar224._4_4_;
        fVar278 = -fVar204 * fVar156 * auVar224._8_4_;
        fVar290 = -fVar206 * fVar256 * auVar224._12_4_;
        fVar267 = fVar302 + fVar254;
        fVar277 = fVar303 + fVar265;
        fVar280 = fVar304 + fVar278;
        fVar282 = fVar306 + fVar290;
        fVar206 = fVar117 * 0.0 * auVar224._0_4_;
        fVar247 = fVar230 * 0.0 * auVar224._4_4_;
        fVar263 = fVar156 * 0.0 * auVar224._8_4_;
        fVar305 = fVar256 * 0.0 * auVar224._12_4_;
        fVar117 = local_318 - fVar291;
        fVar156 = fStack_314 - fVar292;
        fVar169 = fStack_310 - fVar293;
        fVar188 = fStack_30c - fVar311;
        fVar238 = fVar172 + fVar206;
        fVar246 = fVar189 + fVar247;
        fVar248 = fVar192 + fVar263;
        fVar250 = fVar194 + fVar305;
        fVar204 = local_258 - fVar154;
        fVar230 = fStack_254 - fVar159;
        fVar256 = fStack_250 - fVar171;
        fVar264 = fStack_24c - fVar191;
        fVar252 = fVar173 - fVar266;
        fVar255 = fVar190 - fVar276;
        fVar275 = fVar193 - fVar279;
        fVar283 = fVar195 - fVar281;
        uVar77 = -(uint)(0.0 < (fVar204 * (fVar238 - fVar252) - fVar252 * (fVar267 - fVar204)) * 0.0
                               + (fVar252 * (fVar312 - fVar117) - (fVar238 - fVar252) * fVar117) *
                                 0.0 + ((fVar267 - fVar204) * fVar117 -
                                       (fVar312 - fVar117) * fVar204));
        uVar74 = -(uint)(0.0 < (fVar230 * (fVar246 - fVar255) - fVar255 * (fVar277 - fVar230)) * 0.0
                               + (fVar255 * (fVar313 - fVar156) - (fVar246 - fVar255) * fVar156) *
                                 0.0 + ((fVar277 - fVar230) * fVar156 -
                                       (fVar313 - fVar156) * fVar230));
        uVar76 = -(uint)(0.0 < (fVar256 * (fVar248 - fVar275) - fVar275 * (fVar280 - fVar256)) * 0.0
                               + (fVar275 * (fVar249 - fVar169) - (fVar248 - fVar275) * fVar169) *
                                 0.0 + ((fVar280 - fVar256) * fVar169 -
                                       (fVar249 - fVar169) * fVar256));
        uVar78 = -(uint)(0.0 < (fVar264 * (fVar250 - fVar283) - fVar283 * (fVar282 - fVar264)) * 0.0
                               + (fVar283 * (fVar251 - fVar188) - (fVar250 - fVar283) * fVar188) *
                                 0.0 + ((fVar282 - fVar264) * fVar188 -
                                       (fVar251 - fVar188) * fVar264));
        fVar291 = (float)((uint)(local_248 - fVar120) & uVar77 |
                         ~uVar77 & (uint)(local_318 + fVar291));
        fVar292 = (float)((uint)(fStack_244 - fVar155) & uVar74 |
                         ~uVar74 & (uint)(fStack_314 + fVar292));
        fVar293 = (float)((uint)(fStack_240 - fVar157) & uVar76 |
                         ~uVar76 & (uint)(fStack_310 + fVar293));
        fVar311 = (float)((uint)(fStack_23c - fVar158) & uVar78 |
                         ~uVar78 & (uint)(fStack_30c + fVar311));
        fVar120 = (float)((uint)(fVar302 - fVar254) & uVar77 | ~uVar77 & (uint)(local_258 + fVar154)
                         );
        fVar155 = (float)((uint)(fVar303 - fVar265) & uVar74 |
                         ~uVar74 & (uint)(fStack_254 + fVar159));
        fVar157 = (float)((uint)(fVar304 - fVar278) & uVar76 |
                         ~uVar76 & (uint)(fStack_250 + fVar171));
        fVar158 = (float)((uint)(fVar306 - fVar290) & uVar78 |
                         ~uVar78 & (uint)(fStack_24c + fVar191));
        fVar172 = (float)((uint)(fVar172 - fVar206) & uVar77 | ~uVar77 & (uint)(fVar173 + fVar266));
        fVar173 = (float)((uint)(fVar189 - fVar247) & uVar74 | ~uVar74 & (uint)(fVar190 + fVar276));
        fVar189 = (float)((uint)(fVar192 - fVar263) & uVar76 | ~uVar76 & (uint)(fVar193 + fVar279));
        fVar190 = (float)((uint)(fVar194 - fVar305) & uVar78 | ~uVar78 & (uint)(fVar195 + fVar281));
        fVar154 = (float)((uint)fVar117 & uVar77 | ~uVar77 & (uint)fVar312);
        fVar159 = (float)((uint)fVar156 & uVar74 | ~uVar74 & (uint)fVar313);
        fVar171 = (float)((uint)fVar169 & uVar76 | ~uVar76 & (uint)fVar249);
        fVar191 = (float)((uint)fVar188 & uVar78 | ~uVar78 & (uint)fVar251);
        fVar206 = (float)((uint)fVar204 & uVar77 | ~uVar77 & (uint)fVar267);
        fVar247 = (float)((uint)fVar230 & uVar74 | ~uVar74 & (uint)fVar277);
        fVar263 = (float)((uint)fVar256 & uVar76 | ~uVar76 & (uint)fVar280);
        fVar305 = (float)((uint)fVar264 & uVar78 | ~uVar78 & (uint)fVar282);
        fVar254 = (float)((uint)fVar252 & uVar77 | ~uVar77 & (uint)fVar238);
        fVar265 = (float)((uint)fVar255 & uVar74 | ~uVar74 & (uint)fVar246);
        fVar278 = (float)((uint)fVar275 & uVar76 | ~uVar76 & (uint)fVar248);
        fVar290 = (float)((uint)fVar283 & uVar78 | ~uVar78 & (uint)fVar250);
        fVar302 = (float)((uint)fVar312 & uVar77 | ~uVar77 & (uint)fVar117) - fVar291;
        fVar303 = (float)((uint)fVar313 & uVar74 | ~uVar74 & (uint)fVar156) - fVar292;
        fVar304 = (float)((uint)fVar249 & uVar76 | ~uVar76 & (uint)fVar169) - fVar293;
        fVar306 = (float)((uint)fVar251 & uVar78 | ~uVar78 & (uint)fVar188) - fVar311;
        fVar312 = (float)((uint)fVar267 & uVar77 | ~uVar77 & (uint)fVar204) - fVar120;
        fVar313 = (float)((uint)fVar277 & uVar74 | ~uVar74 & (uint)fVar230) - fVar155;
        fVar249 = (float)((uint)fVar280 & uVar76 | ~uVar76 & (uint)fVar256) - fVar157;
        fVar251 = (float)((uint)fVar282 & uVar78 | ~uVar78 & (uint)fVar264) - fVar158;
        fVar252 = (float)((uint)fVar238 & uVar77 | ~uVar77 & (uint)fVar252) - fVar172;
        fVar255 = (float)((uint)fVar246 & uVar74 | ~uVar74 & (uint)fVar255) - fVar173;
        fVar275 = (float)((uint)fVar248 & uVar76 | ~uVar76 & (uint)fVar275) - fVar189;
        fVar283 = (float)((uint)fVar250 & uVar78 | ~uVar78 & (uint)fVar283) - fVar190;
        fVar192 = fVar291 - fVar154;
        fVar193 = fVar292 - fVar159;
        fVar194 = fVar293 - fVar171;
        fVar195 = fVar311 - fVar191;
        fVar204 = fVar120 - fVar206;
        fVar230 = fVar155 - fVar247;
        fVar256 = fVar157 - fVar263;
        fVar264 = fVar158 - fVar305;
        fVar117 = fVar172 - fVar254;
        fVar156 = fVar173 - fVar265;
        fVar169 = fVar189 - fVar278;
        fVar188 = fVar190 - fVar290;
        fVar267 = (fVar120 * fVar252 - fVar172 * fVar312) * 0.0 +
                  (fVar172 * fVar302 - fVar291 * fVar252) * 0.0 +
                  (fVar291 * fVar312 - fVar120 * fVar302);
        fVar277 = (fVar155 * fVar255 - fVar173 * fVar313) * 0.0 +
                  (fVar173 * fVar303 - fVar292 * fVar255) * 0.0 +
                  (fVar292 * fVar313 - fVar155 * fVar303);
        auVar179._4_4_ = fVar277;
        auVar179._0_4_ = fVar267;
        fVar280 = (fVar157 * fVar275 - fVar189 * fVar249) * 0.0 +
                  (fVar189 * fVar304 - fVar293 * fVar275) * 0.0 +
                  (fVar293 * fVar249 - fVar157 * fVar304);
        fVar282 = (fVar158 * fVar283 - fVar190 * fVar251) * 0.0 +
                  (fVar190 * fVar306 - fVar311 * fVar283) * 0.0 +
                  (fVar311 * fVar251 - fVar158 * fVar306);
        auVar314._0_4_ =
             (fVar206 * fVar117 - fVar254 * fVar204) * 0.0 +
             (fVar254 * fVar192 - fVar154 * fVar117) * 0.0 + (fVar154 * fVar204 - fVar206 * fVar192)
        ;
        auVar314._4_4_ =
             (fVar247 * fVar156 - fVar265 * fVar230) * 0.0 +
             (fVar265 * fVar193 - fVar159 * fVar156) * 0.0 + (fVar159 * fVar230 - fVar247 * fVar193)
        ;
        auVar314._8_4_ =
             (fVar263 * fVar169 - fVar278 * fVar256) * 0.0 +
             (fVar278 * fVar194 - fVar171 * fVar169) * 0.0 + (fVar171 * fVar256 - fVar263 * fVar194)
        ;
        auVar314._12_4_ =
             (fVar305 * fVar188 - fVar290 * fVar264) * 0.0 +
             (fVar290 * fVar195 - fVar191 * fVar188) * 0.0 + (fVar191 * fVar264 - fVar305 * fVar195)
        ;
        auVar179._8_4_ = fVar280;
        auVar179._12_4_ = fVar282;
        auVar82 = maxps(auVar179,auVar314);
        bVar54 = auVar82._0_4_ <= 0.0 && bVar54;
        auVar180._0_4_ = -(uint)bVar54;
        bVar55 = auVar82._4_4_ <= 0.0 && bVar55;
        auVar180._4_4_ = -(uint)bVar55;
        bVar53 = auVar82._8_4_ <= 0.0 && bVar53;
        auVar180._8_4_ = -(uint)bVar53;
        bVar52 = auVar82._12_4_ <= 0.0 && bVar52;
        auVar180._12_4_ = -(uint)bVar52;
        iVar57 = movmskps(iVar57,auVar180);
        if (iVar57 == 0) {
          auVar181._8_8_ = uStack_3c0;
          auVar181._0_8_ = local_3c8;
          iVar57 = 0;
        }
        else {
          auVar199._0_4_ = fVar117 * fVar312;
          auVar199._4_4_ = fVar156 * fVar313;
          auVar199._8_4_ = fVar169 * fVar249;
          auVar199._12_4_ = fVar188 * fVar251;
          fVar206 = fVar204 * fVar252 - auVar199._0_4_;
          fVar247 = fVar230 * fVar255 - auVar199._4_4_;
          fVar263 = fVar256 * fVar275 - auVar199._8_4_;
          fVar305 = fVar264 * fVar283 - auVar199._12_4_;
          fVar117 = fVar117 * fVar302 - fVar252 * fVar192;
          fVar156 = fVar156 * fVar303 - fVar255 * fVar193;
          fVar169 = fVar169 * fVar304 - fVar275 * fVar194;
          fVar188 = fVar188 * fVar306 - fVar283 * fVar195;
          fVar204 = fVar192 * fVar312 - fVar204 * fVar302;
          fVar230 = fVar193 * fVar313 - fVar230 * fVar303;
          fVar256 = fVar194 * fVar249 - fVar256 * fVar304;
          fVar264 = fVar195 * fVar251 - fVar264 * fVar306;
          auVar225._0_4_ = fVar206 * 0.0 + fVar117 * 0.0 + fVar204;
          auVar225._4_4_ = fVar247 * 0.0 + fVar156 * 0.0 + fVar230;
          auVar225._8_4_ = fVar263 * 0.0 + fVar169 * 0.0 + fVar256;
          auVar225._12_4_ = fVar305 * 0.0 + fVar188 * 0.0 + fVar264;
          auVar82 = rcpps(auVar199,auVar225);
          fVar154 = auVar82._0_4_;
          fVar159 = auVar82._4_4_;
          fVar171 = auVar82._8_4_;
          fVar191 = auVar82._12_4_;
          fVar154 = (1.0 - auVar225._0_4_ * fVar154) * fVar154 + fVar154;
          fVar159 = (1.0 - auVar225._4_4_ * fVar159) * fVar159 + fVar159;
          fVar171 = (1.0 - auVar225._8_4_ * fVar171) * fVar171 + fVar171;
          fVar191 = (1.0 - auVar225._12_4_ * fVar191) * fVar191 + fVar191;
          fVar204 = (fVar172 * fVar204 + fVar120 * fVar117 + fVar291 * fVar206) * fVar154;
          fVar156 = (fVar173 * fVar230 + fVar155 * fVar156 + fVar292 * fVar247) * fVar159;
          fVar169 = (fVar189 * fVar256 + fVar157 * fVar169 + fVar293 * fVar263) * fVar171;
          fVar188 = (fVar190 * fVar264 + fVar158 * fVar188 + fVar311 * fVar305) * fVar191;
          fVar117 = *(float *)(ray + k * 4 + 0x80);
          bVar54 = (fVar204 <= fVar117 && fVar170 <= fVar204) && bVar54;
          auVar103._0_4_ = -(uint)bVar54;
          bVar55 = (fVar156 <= fVar117 && fVar170 <= fVar156) && bVar55;
          auVar103._4_4_ = -(uint)bVar55;
          bVar53 = (fVar169 <= fVar117 && fVar170 <= fVar169) && bVar53;
          auVar103._8_4_ = -(uint)bVar53;
          bVar52 = (fVar188 <= fVar117 && fVar170 <= fVar188) && bVar52;
          auVar103._12_4_ = -(uint)bVar52;
          iVar57 = movmskps(iVar57,auVar103);
          if (iVar57 == 0) {
            auVar181._8_8_ = uStack_3c0;
            auVar181._0_8_ = local_3c8;
            iVar57 = 0;
          }
          else {
            auVar104._0_8_ =
                 CONCAT44(-(uint)(auVar225._4_4_ != 0.0 && bVar55),
                          -(uint)(auVar225._0_4_ != 0.0 && bVar54));
            auVar104._8_4_ = -(uint)(auVar225._8_4_ != 0.0 && bVar53);
            auVar104._12_4_ = -(uint)(auVar225._12_4_ != 0.0 && bVar52);
            iVar57 = movmskps(iVar57,auVar104);
            auVar181._8_8_ = uStack_3c0;
            auVar181._0_8_ = local_3c8;
            if (iVar57 != 0) {
              fVar267 = fVar267 * fVar154;
              fVar277 = fVar277 * fVar159;
              fVar280 = fVar280 * fVar171;
              fVar282 = fVar282 * fVar191;
              local_438 = (float)((uint)(1.0 - fVar267) & uVar77 | ~uVar77 & (uint)fVar267);
              fStack_434 = (float)((uint)(1.0 - fVar277) & uVar74 | ~uVar74 & (uint)fVar277);
              fStack_430 = (float)((uint)(1.0 - fVar280) & uVar76 | ~uVar76 & (uint)fVar280);
              fStack_42c = (float)((uint)(1.0 - fVar282) & uVar78 | ~uVar78 & (uint)fVar282);
              local_288 = (float)(~uVar77 & (uint)(auVar314._0_4_ * fVar154) |
                                 (uint)(1.0 - auVar314._0_4_ * fVar154) & uVar77);
              fStack_284 = (float)(~uVar74 & (uint)(auVar314._4_4_ * fVar159) |
                                  (uint)(1.0 - auVar314._4_4_ * fVar159) & uVar74);
              fStack_280 = (float)(~uVar76 & (uint)(auVar314._8_4_ * fVar171) |
                                  (uint)(1.0 - auVar314._8_4_ * fVar171) & uVar76);
              fStack_27c = (float)(~uVar78 & (uint)(auVar314._12_4_ * fVar191) |
                                  (uint)(1.0 - auVar314._12_4_ * fVar191) & uVar78);
              auVar181._8_4_ = auVar104._8_4_;
              auVar181._0_8_ = auVar104._0_8_;
              auVar181._12_4_ = auVar104._12_4_;
              local_448 = fVar204;
              fStack_444 = fVar156;
              fStack_440 = fVar169;
              fStack_43c = fVar188;
            }
          }
        }
        iVar57 = movmskps(iVar57,auVar181);
        fVar204 = local_328;
        fVar206 = fStack_324;
        fVar230 = fStack_320;
        fVar247 = fStack_31c;
        fVar169 = local_308;
        fVar171 = fStack_304;
        fVar188 = fStack_300;
        fVar191 = fStack_2fc;
        if (iVar57 != 0) {
          fVar117 = (auVar224._0_4_ - auVar299._0_4_) * local_438 + auVar299._0_4_;
          fVar154 = (auVar224._4_4_ - auVar299._4_4_) * fStack_434 + auVar299._4_4_;
          fVar156 = (auVar224._8_4_ - auVar299._8_4_) * fStack_430 + auVar299._8_4_;
          fVar159 = (auVar224._12_4_ - auVar299._12_4_) * fStack_42c + auVar299._12_4_;
          fVar170 = *(float *)((long)local_3e0->ray_space + k * 4 + -0x10);
          auVar105._0_4_ = -(uint)(fVar170 * (fVar117 + fVar117) < local_448) & auVar181._0_4_;
          auVar105._4_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_444) & auVar181._4_4_;
          auVar105._8_4_ = -(uint)(fVar170 * (fVar156 + fVar156) < fStack_440) & auVar181._8_4_;
          auVar105._12_4_ = -(uint)(fVar170 * (fVar159 + fVar159) < fStack_43c) & auVar181._12_4_;
          iVar57 = movmskps((int)local_3e0,auVar105);
          if (iVar57 != 0) {
            local_288 = local_288 + local_288 + -1.0;
            fStack_284 = fStack_284 + fStack_284 + -1.0;
            fStack_280 = fStack_280 + fStack_280 + -1.0;
            fStack_27c = fStack_27c + fStack_27c + -1.0;
            local_1d8 = 0;
            local_1c8 = CONCAT44(fVar205,fVar196);
            uStack_1c0 = CONCAT44(fVar231,fVar229);
            local_1b8 = CONCAT44(fStack_3a4,local_3a8);
            uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
            local_1a8 = CONCAT44(fStack_3b4,local_3b8);
            uStack_1a0 = CONCAT44(fStack_3ac,fStack_3b0);
            local_198 = CONCAT44(fStack_394,local_398);
            uStack_190 = CONCAT44(fStack_38c,fStack_390);
            local_208 = local_438;
            fStack_204 = fStack_434;
            fStack_200 = fStack_430;
            fStack_1fc = fStack_42c;
            local_1f8 = local_288;
            fStack_1f4 = fStack_284;
            fStack_1f0 = fStack_280;
            fStack_1ec = fStack_27c;
            local_1e8 = local_448;
            fStack_1e4 = fStack_444;
            fStack_1e0 = fStack_440;
            fStack_1dc = fStack_43c;
            local_1d4 = iVar22;
            local_188 = auVar105;
            if ((pGVar23->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar81 = 1.0 / fVar81;
              local_178[0] = fVar81 * (local_438 + 0.0);
              local_178[1] = fVar81 * (fStack_434 + 1.0);
              local_178[2] = fVar81 * (fStack_430 + 2.0);
              local_178[3] = fVar81 * (fStack_42c + 3.0);
              local_168 = CONCAT44(fStack_284,local_288);
              uStack_160 = CONCAT44(fStack_27c,fStack_280);
              local_158[0] = local_448;
              local_158[1] = fStack_444;
              local_158[2] = fStack_440;
              local_158[3] = fStack_43c;
              auVar136._0_4_ = auVar105._0_4_ & (uint)local_448;
              auVar136._4_4_ = auVar105._4_4_ & (uint)fStack_444;
              auVar136._8_4_ = auVar105._8_4_ & (uint)fStack_440;
              auVar136._12_4_ = auVar105._12_4_ & (uint)fStack_43c;
              auVar162._0_8_ = CONCAT44(~auVar105._4_4_,~auVar105._0_4_) & 0x7f8000007f800000;
              auVar162._8_4_ = ~auVar105._8_4_ & 0x7f800000;
              auVar162._12_4_ = ~auVar105._12_4_ & 0x7f800000;
              auVar162 = auVar162 | auVar136;
              auVar182._4_4_ = auVar162._0_4_;
              auVar182._0_4_ = auVar162._4_4_;
              auVar182._8_4_ = auVar162._12_4_;
              auVar182._12_4_ = auVar162._8_4_;
              auVar82 = minps(auVar182,auVar162);
              auVar137._0_8_ = auVar82._8_8_;
              auVar137._8_4_ = auVar82._0_4_;
              auVar137._12_4_ = auVar82._4_4_;
              auVar82 = minps(auVar137,auVar82);
              auVar138._0_8_ =
                   CONCAT44(-(uint)(auVar82._4_4_ == auVar162._4_4_) & auVar105._4_4_,
                            -(uint)(auVar82._0_4_ == auVar162._0_4_) & auVar105._0_4_);
              auVar138._8_4_ = -(uint)(auVar82._8_4_ == auVar162._8_4_) & auVar105._8_4_;
              auVar138._12_4_ = -(uint)(auVar82._12_4_ == auVar162._12_4_) & auVar105._12_4_;
              iVar57 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar138);
              auVar106 = auVar105;
              if (iVar57 != 0) {
                auVar106._8_4_ = auVar138._8_4_;
                auVar106._0_8_ = auVar138._0_8_;
                auVar106._12_4_ = auVar138._12_4_;
              }
              uVar77 = movmskps(iVar57,auVar106);
              lVar70 = 0;
              if (uVar77 != 0) {
                for (; (uVar77 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
                }
              }
              local_408 = auVar105;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar23->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                fVar170 = local_178[lVar70];
                uVar58 = *(undefined4 *)((long)&local_168 + lVar70 * 4);
                fVar81 = 1.0 - fVar170;
                fVar154 = fVar170 * fVar81 + fVar170 * fVar81;
                fVar117 = fVar81 * fVar81 * -3.0;
                fVar156 = (fVar81 * fVar81 - fVar154) * 3.0;
                fVar81 = (fVar154 - fVar170 * fVar170) * 3.0;
                fVar154 = fVar170 * fVar170 * 3.0;
                *(float *)(ray + k * 4 + 0x80) = local_158[lVar70];
                *(float *)(ray + k * 4 + 0xc0) =
                     fVar117 * fVar196 +
                     fVar156 * local_3a8 + fVar81 * local_3b8 + fVar154 * local_398;
                *(float *)(ray + k * 4 + 0xd0) =
                     fVar117 * fVar205 +
                     fVar156 * fStack_3a4 + fVar81 * fStack_3b4 + fVar154 * fStack_394;
                *(float *)(ray + k * 4 + 0xe0) =
                     fVar117 * fVar229 +
                     fVar156 * fStack_3a0 + fVar81 * fStack_3b0 + fVar154 * fStack_390;
                *(float *)(ray + k * 4 + 0xf0) = fVar170;
                *(undefined4 *)(ray + k * 4 + 0x100) = uVar58;
                *(uint *)(ray + k * 4 + 0x110) = uVar75;
                *(uint *)(ray + k * 4 + 0x120) = uVar73;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                pRVar67 = (RTCIntersectArguments *)context;
              }
              else {
                local_508 = CONCAT44(uVar73,uVar73);
                uStack_500._0_4_ = uVar73;
                uStack_500._4_4_ = uVar73;
                local_4e8 = CONCAT44(uVar75,uVar75);
                uStack_4e0._0_4_ = uVar75;
                uStack_4e0._4_4_ = uVar75;
                auVar82 = *local_2c8;
                _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                while( true ) {
                  local_e8 = local_178[lVar70];
                  local_d8 = *(undefined4 *)((long)&local_168 + lVar70 * 4);
                  *(float *)(ray + k * 4 + 0x80) = local_158[lVar70];
                  fVar170 = 1.0 - local_e8;
                  fVar117 = local_e8 * fVar170 + local_e8 * fVar170;
                  fVar154 = (fVar117 - local_e8 * local_e8) * 3.0;
                  fVar81 = local_e8 * local_e8 * 3.0;
                  fVar117 = (fVar170 * fVar170 - fVar117) * 3.0;
                  local_378.context = context->user;
                  fVar170 = fVar170 * fVar170 * -3.0;
                  local_118._0_4_ =
                       fVar170 * fVar196 +
                       fVar117 * local_3a8 + fVar154 * local_3b8 + fVar81 * local_398;
                  local_108 = fVar170 * fVar205 +
                              fVar117 * fStack_3a4 + fVar154 * fStack_3b4 + fVar81 * fStack_394;
                  local_f8 = fVar170 * fVar229 +
                             fVar117 * fStack_3a0 + fVar154 * fStack_3b0 + fVar81 * fStack_390;
                  local_118._4_4_ = local_118._0_4_;
                  local_118._8_4_ = local_118._0_4_;
                  fStack_10c = (float)local_118._0_4_;
                  fStack_104 = local_108;
                  fStack_100 = local_108;
                  fStack_fc = local_108;
                  fStack_f4 = local_f8;
                  fStack_f0 = local_f8;
                  fStack_ec = local_f8;
                  fStack_e4 = local_e8;
                  fStack_e0 = local_e8;
                  fStack_dc = local_e8;
                  uStack_d4 = local_d8;
                  uStack_d0 = local_d8;
                  uStack_cc = local_d8;
                  local_c8 = local_4e8;
                  uStack_c0 = uStack_4e0;
                  local_b8 = local_508;
                  uStack_b0 = uStack_500;
                  local_a8 = (local_378.context)->instID[0];
                  uStack_a4 = local_a8;
                  uStack_a0 = local_a8;
                  uStack_9c = local_a8;
                  local_98 = (local_378.context)->instPrimID[0];
                  uStack_94 = local_98;
                  uStack_90 = local_98;
                  uStack_8c = local_98;
                  local_378.valid = (int *)local_3f8;
                  pRVar67 = (RTCIntersectArguments *)pGVar23->userPtr;
                  local_378.hit = (RTCHitN *)local_118;
                  local_378.N = 4;
                  p_Var61 = pGVar23->intersectionFilterN;
                  auVar323._8_8_ = pGVar69;
                  auVar323._0_8_ = p_Var61;
                  local_3f8 = auVar82;
                  local_378.geometryUserPtr = pRVar67;
                  local_378.ray = (RTCRayN *)ray;
                  if (p_Var61 != (RTCFilterFunctionN)0x0) {
                    auVar323 = (*p_Var61)(&local_378);
                    ray = local_2c0;
                  }
                  pGVar69 = auVar323._8_8_;
                  auVar149._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                  auVar149._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                  auVar149._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                  auVar149._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                  uVar77 = movmskps(auVar323._0_4_,auVar149);
                  pRVar62 = (RayHitK<4> *)(ulong)(uVar77 ^ 0xf);
                  if ((uVar77 ^ 0xf) == 0) {
                    auVar149 = auVar149 ^ _DAT_01f7ae20;
                  }
                  else {
                    pRVar67 = context->args;
                    pRVar63 = (RTCIntersectArguments *)pRVar67->filter;
                    auVar56._8_8_ = pGVar69;
                    auVar56._0_8_ = pRVar63;
                    auVar324._8_8_ = pGVar69;
                    auVar324._0_8_ = pRVar63;
                    if ((pRVar63 != (RTCIntersectArguments *)0x0) &&
                       ((((ulong)*(Scene **)&pRVar67->flags & 2) != 0 ||
                        (auVar324 = auVar56, ((pGVar23->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar324 = (*(code *)pRVar63)(&local_378);
                      ray = local_2c0;
                    }
                    pGVar69 = auVar324._8_8_;
                    auVar112._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                    auVar112._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                    auVar112._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                    auVar112._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                    auVar149 = auVar112 ^ _DAT_01f7ae20;
                    uVar77 = movmskps(auVar324._0_4_,auVar112);
                    pRVar62 = (RayHitK<4> *)(ulong)(uVar77 ^ 0xf);
                    if ((uVar77 ^ 0xf) != 0) {
                      RVar28 = *(RTCFeatureFlags *)((long)local_378.hit + 4);
                      uVar77 = *(uint *)((long)local_378.hit + 8);
                      uVar74 = *(uint *)((long)((long)local_378.hit + 8) + 4);
                      *(uint *)(local_378.ray + 0xc0) =
                           ~auVar112._0_4_ & *(uint *)&(local_378.hit)->field_0x0 |
                           *(uint *)(local_378.ray + 0xc0) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xc4) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xc4) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 200) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 200) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0xcc) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0xcc) & auVar112._12_4_;
                      RVar28 = *(RTCFeatureFlags *)((long)((long)local_378.hit + 0x10) + 4);
                      uVar77 = *(uint *)((long)local_378.hit + 0x18);
                      uVar74 = *(uint *)((long)((long)local_378.hit + 0x18) + 4);
                      *(uint *)(local_378.ray + 0xd0) =
                           ~auVar112._0_4_ & *(uint *)((long)local_378.hit + 0x10) |
                           *(uint *)(local_378.ray + 0xd0) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xd4) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xd4) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 0xd8) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 0xd8) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0xdc) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0xdc) & auVar112._12_4_;
                      RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->feature_mask
                      ;
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         context;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x20))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0xe0) =
                           ~auVar112._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->flags |
                           *(uint *)(local_378.ray + 0xe0) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xe4) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xe4) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 0xe8) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 0xe8) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0xec) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0xec) & auVar112._12_4_;
                      RVar28 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                        filter + 4);
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         intersect;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x20))->intersect + 4);
                      *(uint *)(local_378.ray + 0xf0) =
                           ~auVar112._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->filter
                           | *(uint *)(local_378.ray + 0xf0) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0xf4) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0xf4) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 0xf8) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 0xf8) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0xfc) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0xfc) & auVar112._12_4_;
                      RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->feature_mask
                      ;
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         context;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x40))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0x100) =
                           ~auVar112._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->flags |
                           *(uint *)(local_378.ray + 0x100) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0x104) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0x104) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 0x108) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 0x108) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0x10c) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0x10c) & auVar112._12_4_;
                      RVar28 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                        filter + 4);
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         intersect;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x40))->intersect + 4);
                      *(uint *)(local_378.ray + 0x110) =
                           *(uint *)(local_378.ray + 0x110) & auVar112._0_4_ |
                           ~auVar112._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->filter
                      ;
                      *(RTCFeatureFlags *)(local_378.ray + 0x114) =
                           *(RTCFeatureFlags *)(local_378.ray + 0x114) & auVar112._4_4_ |
                           ~auVar112._4_4_ & RVar28;
                      *(uint *)(local_378.ray + 0x118) =
                           *(uint *)(local_378.ray + 0x118) & auVar112._8_4_ |
                           ~auVar112._8_4_ & uVar77;
                      *(uint *)(local_378.ray + 0x11c) =
                           *(uint *)(local_378.ray + 0x11c) & auVar112._12_4_ |
                           ~auVar112._12_4_ & uVar74;
                      RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->feature_mask
                      ;
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         context;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x60))->context + 4);
                      *(RTCRayQueryFlags *)(local_378.ray + 0x120) =
                           *(uint *)(local_378.ray + 0x120) & auVar112._0_4_ |
                           ~auVar112._0_4_ &
                           ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->flags;
                      *(RTCFeatureFlags *)(local_378.ray + 0x124) =
                           *(RTCFeatureFlags *)(local_378.ray + 0x124) & auVar112._4_4_ |
                           ~auVar112._4_4_ & RVar28;
                      *(uint *)(local_378.ray + 0x128) =
                           *(uint *)(local_378.ray + 0x128) & auVar112._8_4_ |
                           ~auVar112._8_4_ & uVar77;
                      *(uint *)(local_378.ray + 300) =
                           *(uint *)(local_378.ray + 300) & auVar112._12_4_ |
                           ~auVar112._12_4_ & uVar74;
                      RVar28 = *(RTCFeatureFlags *)
                                ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                        filter + 4);
                      uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         intersect;
                      uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                ((long)local_378.hit + 0x60))->intersect + 4);
                      *(uint *)(local_378.ray + 0x130) =
                           ~auVar112._0_4_ &
                           *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->filter
                           | *(uint *)(local_378.ray + 0x130) & auVar112._0_4_;
                      *(RTCFeatureFlags *)(local_378.ray + 0x134) =
                           ~auVar112._4_4_ & RVar28 |
                           *(RTCFeatureFlags *)(local_378.ray + 0x134) & auVar112._4_4_;
                      *(uint *)(local_378.ray + 0x138) =
                           ~auVar112._8_4_ & uVar77 |
                           *(uint *)(local_378.ray + 0x138) & auVar112._8_4_;
                      *(uint *)(local_378.ray + 0x13c) =
                           ~auVar112._12_4_ & uVar74 |
                           *(uint *)(local_378.ray + 0x13c) & auVar112._12_4_;
                      auVar20._0_4_ = *(undefined4 *)(local_378.hit + 0x80);
                      auVar20._4_4_ = *(undefined4 *)(local_378.hit + 0x84);
                      auVar20._8_8_ = *(undefined8 *)(local_378.hit + 0x88);
                      *(undefined1 (*) [16])(local_378.ray + 0x140) =
                           ~auVar112 & auVar20 |
                           *(undefined1 (*) [16])(local_378.ray + 0x140) & auVar112;
                      pRVar62 = (RayHitK<4> *)local_378.ray;
                      pRVar67 = (RTCIntersectArguments *)local_378.hit;
                    }
                  }
                  auVar150._0_4_ = auVar149._0_4_ << 0x1f;
                  auVar150._4_4_ = auVar149._4_4_ << 0x1f;
                  auVar150._8_4_ = auVar149._8_4_ << 0x1f;
                  auVar150._12_4_ = auVar149._12_4_ << 0x1f;
                  iVar57 = movmskps((int)pRVar62,auVar150);
                  if (iVar57 == 0) {
                    *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                  }
                  else {
                    local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                    local_518._4_4_ = 0;
                    fStack_510 = 0.0;
                    uStack_50c = 0;
                  }
                  *(undefined4 *)(local_408 + lVar70 * 4) = 0;
                  local_408._0_4_ = -(uint)(local_448 <= (float)local_518._0_4_) & local_408._0_4_;
                  local_408._4_4_ = -(uint)(fStack_444 <= (float)local_518._0_4_) & local_408._4_4_;
                  local_408._8_4_ = -(uint)(fStack_440 <= (float)local_518._0_4_) & local_408._8_4_;
                  local_408._12_4_ =
                       -(uint)(fStack_43c <= (float)local_518._0_4_) & local_408._12_4_;
                  iVar57 = movmskps(iVar57,local_408);
                  if (iVar57 == 0) break;
                  auVar151._0_4_ = local_408._0_4_ & (uint)local_448;
                  auVar151._4_4_ = local_408._4_4_ & (uint)fStack_444;
                  auVar151._8_4_ = local_408._8_4_ & (uint)fStack_440;
                  auVar151._12_4_ = local_408._12_4_ & (uint)fStack_43c;
                  auVar168._0_8_ = CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
                  auVar168._8_4_ = ~local_408._8_4_ & 0x7f800000;
                  auVar168._12_4_ = ~local_408._12_4_ & 0x7f800000;
                  auVar168 = auVar168 | auVar151;
                  auVar187._4_4_ = auVar168._0_4_;
                  auVar187._0_4_ = auVar168._4_4_;
                  auVar187._8_4_ = auVar168._12_4_;
                  auVar187._12_4_ = auVar168._8_4_;
                  auVar161 = minps(auVar187,auVar168);
                  auVar152._0_8_ = auVar161._8_8_;
                  auVar152._8_4_ = auVar161._0_4_;
                  auVar152._12_4_ = auVar161._4_4_;
                  auVar161 = minps(auVar152,auVar161);
                  auVar153._0_8_ =
                       CONCAT44(-(uint)(auVar161._4_4_ == auVar168._4_4_) & local_408._4_4_,
                                -(uint)(auVar161._0_4_ == auVar168._0_4_) & local_408._0_4_);
                  auVar153._8_4_ = -(uint)(auVar161._8_4_ == auVar168._8_4_) & local_408._8_4_;
                  auVar153._12_4_ = -(uint)(auVar161._12_4_ == auVar168._12_4_) & local_408._12_4_;
                  iVar57 = movmskps(iVar57,auVar153);
                  auVar113 = local_408;
                  if (iVar57 != 0) {
                    auVar113._8_4_ = auVar153._8_4_;
                    auVar113._0_8_ = auVar153._0_8_;
                    auVar113._12_4_ = auVar153._12_4_;
                  }
                  uVar58 = movmskps(iVar57,auVar113);
                  uVar64 = CONCAT44((int)((ulong)pRVar62 >> 0x20),uVar58);
                  lVar70 = 0;
                  if (uVar64 != 0) {
                    for (; (uVar64 >> lVar70 & 1) == 0; lVar70 = lVar70 + 1) {
                    }
                  }
                }
              }
              iVar65 = (int)pRVar67;
              prim = local_3e8;
              fVar204 = local_328;
              fVar206 = fStack_324;
              fVar230 = fStack_320;
              fVar247 = fStack_31c;
              fVar169 = local_308;
              fVar171 = fStack_304;
              fVar188 = fStack_300;
              fVar191 = fStack_2fc;
            }
          }
        }
      }
      fStack_2fc = fVar191;
      fStack_300 = fVar188;
      fStack_304 = fVar171;
      local_308 = fVar169;
      fStack_31c = fVar247;
      fStack_320 = fVar230;
      fStack_324 = fVar206;
      local_328 = fVar204;
      if (4 < iVar22) {
        local_58 = iVar22;
        iStack_54 = iVar22;
        iStack_50 = iVar22;
        iStack_4c = iVar22;
        local_388._4_4_ = local_388._0_4_;
        fStack_380 = (float)local_388._0_4_;
        fStack_37c = (float)local_388._0_4_;
        local_88 = 1.0 / (float)local_2b8._0_4_;
        fStack_84 = local_88;
        fStack_80 = local_88;
        fStack_7c = local_88;
        local_68 = uVar73;
        uStack_64 = uVar73;
        uStack_60 = uVar73;
        uStack_5c = uVar73;
        local_78 = uVar75;
        uStack_74 = uVar75;
        uStack_70 = uVar75;
        uStack_6c = uVar75;
        lVar70 = 4;
        do {
          uVar74 = (uint)lVar70;
          pRVar67 = (RTCIntersectArguments *)(bezier_basis0 + lVar26);
          pfVar1 = (float *)((long)&pRVar67->flags + lVar70 * 4);
          fVar170 = *pfVar1;
          fVar81 = pfVar1[1];
          fVar117 = pfVar1[2];
          fVar154 = pfVar1[3];
          pfVar1 = (float *)(lVar26 + 0x21aa768 + lVar70 * 4);
          local_328 = *pfVar1;
          fStack_324 = pfVar1[1];
          fStack_320 = pfVar1[2];
          fStack_31c = pfVar1[3];
          pfVar1 = (float *)(lVar26 + 0x21aabec + lVar70 * 4);
          local_268 = *pfVar1;
          fStack_264 = pfVar1[1];
          fStack_260 = pfVar1[2];
          fStack_25c = pfVar1[3];
          pfVar1 = (float *)(lVar26 + 0x21ab070 + lVar70 * 4);
          local_318 = *pfVar1;
          fStack_314 = pfVar1[1];
          fStack_310 = pfVar1[2];
          fStack_30c = pfVar1[3];
          local_308 = local_238 * fVar170 +
                      fVar235 * local_328 + local_2d8 * local_268 + fVar116 * local_318;
          fStack_304 = fStack_234 * fVar81 +
                       fVar235 * fStack_324 + fStack_2d4 * fStack_264 + fVar116 * fStack_314;
          fStack_300 = fStack_230 * fVar117 +
                       fVar235 * fStack_320 + fStack_2d0 * fStack_260 + fVar116 * fStack_310;
          fStack_2fc = fStack_22c * fVar154 +
                       fVar235 * fStack_31c + fStack_2cc * fStack_25c + fVar116 * fStack_30c;
          local_258 = local_2a8 * fVar170 +
                      fVar236 * local_328 + local_2e8 * local_268 + fVar119 * local_318;
          fStack_254 = fStack_2a4 * fVar81 +
                       fVar236 * fStack_324 + fStack_2e4 * fStack_264 + fVar119 * fStack_314;
          fStack_250 = fStack_2a0 * fVar117 +
                       fVar236 * fStack_320 + fStack_2e0 * fStack_260 + fVar119 * fStack_310;
          fStack_24c = fStack_29c * fVar154 +
                       fVar236 * fStack_31c + fStack_2dc * fStack_25c + fVar119 * fStack_30c;
          auVar140._0_4_ =
               local_148 * fVar170 +
               local_138 * local_328 + local_228 * local_268 + local_128 * local_318;
          auVar140._4_4_ =
               fStack_144 * fVar81 +
               fStack_134 * fStack_324 + fStack_224 * fStack_264 + fStack_124 * fStack_314;
          auVar140._8_4_ =
               fStack_140 * fVar117 +
               fStack_130 * fStack_320 + fStack_220 * fStack_260 + fStack_120 * fStack_310;
          auVar140._12_4_ =
               fStack_13c * fVar154 +
               fStack_12c * fStack_31c + fStack_21c * fStack_25c + fStack_11c * fStack_30c;
          pfVar1 = (float *)(bezier_basis1 + lVar26 + lVar70 * 4);
          fVar156 = *pfVar1;
          fVar159 = pfVar1[1];
          fVar169 = pfVar1[2];
          fVar171 = pfVar1[3];
          pfVar1 = (float *)(lVar26 + 0x21acb88 + lVar70 * 4);
          fVar188 = *pfVar1;
          fVar191 = pfVar1[1];
          fVar204 = pfVar1[2];
          fVar206 = pfVar1[3];
          pfVar1 = (float *)(lVar26 + 0x21ad00c + lVar70 * 4);
          fVar230 = *pfVar1;
          fVar247 = pfVar1[1];
          fVar256 = pfVar1[2];
          fVar263 = pfVar1[3];
          pauVar9 = (undefined1 (*) [12])(lVar26 + 0x21ad490 + lVar70 * 4);
          fVar264 = *(float *)*pauVar9;
          fVar305 = *(float *)(*pauVar9 + 4);
          fVar252 = *(float *)(*pauVar9 + 8);
          auVar31 = *pauVar9;
          fVar254 = *(float *)pauVar9[1];
          local_248 = local_238 * fVar156 +
                      fVar235 * fVar188 + local_2d8 * fVar230 + fVar116 * fVar264;
          fStack_244 = fStack_234 * fVar159 +
                       fVar235 * fVar191 + fStack_2d4 * fVar247 + fVar116 * fVar305;
          fStack_240 = fStack_230 * fVar169 +
                       fVar235 * fVar204 + fStack_2d0 * fVar256 + fVar116 * fVar252;
          fStack_23c = fStack_22c * fVar171 +
                       fVar235 * fVar206 + fStack_2cc * fVar263 + fVar116 * fVar254;
          fVar290 = local_2a8 * fVar156 +
                    fVar236 * fVar188 + local_2e8 * fVar230 + fVar119 * fVar264;
          fVar291 = fStack_2a4 * fVar159 +
                    fVar236 * fVar191 + fStack_2e4 * fVar247 + fVar119 * fVar305;
          fVar292 = fStack_2a0 * fVar169 +
                    fVar236 * fVar204 + fStack_2e0 * fVar256 + fVar119 * fVar252;
          fVar293 = fStack_29c * fVar171 +
                    fVar236 * fVar206 + fStack_2dc * fVar263 + fVar119 * fVar254;
          auVar315._0_4_ =
               local_148 * fVar156 + local_138 * fVar188 + local_228 * fVar230 + local_128 * fVar264
          ;
          auVar315._4_4_ =
               fStack_144 * fVar159 +
               fStack_134 * fVar191 + fStack_224 * fVar247 + fStack_124 * fVar305;
          auVar315._8_4_ =
               fStack_140 * fVar169 +
               fStack_130 * fVar204 + fStack_220 * fVar256 + fStack_120 * fVar252;
          auVar315._12_4_ =
               fStack_13c * fVar171 +
               fStack_12c * fVar206 + fStack_21c * fVar263 + fStack_11c * fVar254;
          fVar265 = local_248 - local_308;
          fVar275 = fStack_244 - fStack_304;
          fVar278 = fStack_240 - fStack_300;
          fVar283 = fStack_23c - fStack_2fc;
          fVar264 = fVar290 - local_258;
          fVar305 = fVar291 - fStack_254;
          fVar252 = fVar292 - fStack_250;
          fVar255 = fVar293 - fStack_24c;
          fVar302 = local_258 * fVar265 - local_308 * fVar264;
          fVar303 = fStack_254 * fVar275 - fStack_304 * fVar305;
          fVar304 = fStack_250 * fVar278 - fStack_300 * fVar252;
          fVar306 = fStack_24c * fVar283 - fStack_2fc * fVar255;
          auVar82 = maxps(auVar140,auVar315);
          bVar54 = fVar302 * fVar302 <=
                   auVar82._0_4_ * auVar82._0_4_ * (fVar265 * fVar265 + fVar264 * fVar264) &&
                   (int)uVar74 < local_58;
          auVar244._0_4_ = -(uint)bVar54;
          bVar55 = fVar303 * fVar303 <=
                   auVar82._4_4_ * auVar82._4_4_ * (fVar275 * fVar275 + fVar305 * fVar305) &&
                   (int)(uVar74 | 1) < iStack_54;
          auVar244._4_4_ = -(uint)bVar55;
          bVar53 = fVar304 * fVar304 <=
                   auVar82._8_4_ * auVar82._8_4_ * (fVar278 * fVar278 + fVar252 * fVar252) &&
                   (int)(uVar74 | 2) < iStack_50;
          auVar244._8_4_ = -(uint)bVar53;
          bVar52 = fVar306 * fVar306 <=
                   auVar82._12_4_ * auVar82._12_4_ * (fVar283 * fVar283 + fVar255 * fVar255) &&
                   (int)(uVar74 | 3) < iStack_4c;
          auVar244._12_4_ = -(uint)bVar52;
          uVar77 = movmskps((int)pGVar69,auVar244);
          pGVar69 = (Geometry *)(ulong)uVar77;
          if (uVar77 != 0) {
            local_2b8._4_4_ = fVar275;
            local_2b8._0_4_ = fVar265;
            fStack_2b0 = fVar278;
            fStack_2ac = fVar283;
            local_518._0_4_ = auVar31._0_4_;
            local_518._4_4_ = auVar31._4_4_;
            fStack_510 = auVar31._8_4_;
            fVar157 = (float)local_518._0_4_ * local_298 + fVar230 * local_2f8 + fVar188 * fVar245 +
                      fVar156 * fVar237;
            fVar158 = (float)local_518._4_4_ * fStack_294 + fVar247 * fStack_2f4 + fVar191 * fVar245
                      + fVar159 * fVar237;
            fVar172 = fStack_510 * fStack_290 + fVar256 * fStack_2f0 + fVar204 * fVar245 +
                      fVar169 * fVar237;
            fVar173 = fVar254 * fStack_28c + fVar263 * fStack_2ec + fVar206 * fVar245 +
                      fVar171 * fVar237;
            fVar194 = local_318 * local_298 + local_268 * local_2f8 + local_328 * fVar245 +
                      fVar170 * fVar237;
            fVar195 = fStack_314 * fStack_294 + fStack_264 * fStack_2f4 + fStack_324 * fVar245 +
                      fVar81 * fVar237;
            fVar238 = fStack_310 * fStack_290 + fStack_260 * fStack_2f0 + fStack_320 * fVar245 +
                      fVar117 * fVar237;
            fVar246 = fStack_30c * fStack_28c + fStack_25c * fStack_2ec + fStack_31c * fVar245 +
                      fVar154 * fVar237;
            pfVar1 = (float *)(lVar26 + 0x21ab4f4 + lVar70 * 4);
            fVar170 = *pfVar1;
            fVar81 = pfVar1[1];
            fVar117 = pfVar1[2];
            fVar154 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21ab978 + lVar70 * 4);
            fVar156 = *pfVar1;
            fVar159 = pfVar1[1];
            fVar169 = pfVar1[2];
            fVar171 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21abdfc + lVar70 * 4);
            fVar188 = *pfVar1;
            fVar191 = pfVar1[1];
            fVar204 = pfVar1[2];
            fVar206 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21ac280 + lVar70 * 4);
            fVar230 = *pfVar1;
            fVar247 = pfVar1[1];
            fVar256 = pfVar1[2];
            fVar263 = pfVar1[3];
            fVar248 = local_238 * fVar170 +
                      fVar235 * fVar156 + local_2d8 * fVar188 + fVar116 * fVar230;
            fVar250 = fStack_234 * fVar81 +
                      fVar235 * fVar159 + fStack_2d4 * fVar191 + fVar116 * fVar247;
            fVar266 = fStack_230 * fVar117 +
                      fVar235 * fVar169 + fStack_2d0 * fVar204 + fVar116 * fVar256;
            fVar276 = fStack_22c * fVar154 +
                      fVar235 * fVar171 + fStack_2cc * fVar206 + fVar116 * fVar263;
            fVar189 = local_2a8 * fVar170 +
                      fVar236 * fVar156 + local_2e8 * fVar188 + fVar119 * fVar230;
            fVar190 = fStack_2a4 * fVar81 +
                      fVar236 * fVar159 + fStack_2e4 * fVar191 + fVar119 * fVar247;
            fVar192 = fStack_2a0 * fVar117 +
                      fVar236 * fVar169 + fStack_2e0 * fVar204 + fVar119 * fVar256;
            fVar193 = fStack_29c * fVar154 +
                      fVar236 * fVar171 + fStack_2dc * fVar206 + fVar119 * fVar263;
            pfVar1 = (float *)(lVar26 + 0x21ad914 + lVar70 * 4);
            fVar254 = *pfVar1;
            fVar302 = pfVar1[1];
            fVar303 = pfVar1[2];
            fVar304 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21ae21c + lVar70 * 4);
            fVar306 = *pfVar1;
            fVar311 = pfVar1[1];
            fVar312 = pfVar1[2];
            fVar313 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21ae6a0 + lVar70 * 4);
            fVar249 = *pfVar1;
            fVar251 = pfVar1[1];
            fVar267 = pfVar1[2];
            fVar277 = pfVar1[3];
            pfVar1 = (float *)(lVar26 + 0x21add98 + lVar70 * 4);
            fVar280 = *pfVar1;
            fVar282 = pfVar1[1];
            fVar120 = pfVar1[2];
            fVar155 = pfVar1[3];
            fVar279 = local_238 * fVar254 +
                      fVar235 * fVar280 + local_2d8 * fVar306 + fVar116 * fVar249;
            fVar281 = fStack_234 * fVar302 +
                      fVar235 * fVar282 + fStack_2d4 * fVar311 + fVar116 * fVar251;
            fVar317 = fStack_230 * fVar303 +
                      fVar235 * fVar120 + fStack_2d0 * fVar312 + fVar116 * fVar267;
            fVar318 = fStack_22c * fVar304 +
                      fVar235 * fVar155 + fStack_2cc * fVar313 + fVar116 * fVar277;
            fVar319 = local_2a8 * fVar254 +
                      fVar236 * fVar280 + local_2e8 * fVar306 + fVar119 * fVar249;
            fVar321 = fStack_2a4 * fVar302 +
                      fVar236 * fVar282 + fStack_2e4 * fVar311 + fVar119 * fVar251;
            fVar320 = fStack_2a0 * fVar303 +
                      fVar236 * fVar120 + fStack_2e0 * fVar312 + fVar119 * fVar267;
            fVar322 = fStack_29c * fVar304 +
                      fVar236 * fVar155 + fStack_2dc * fVar313 + fVar119 * fVar277;
            auVar301._0_8_ = CONCAT44(fVar250,fVar248) & 0x7fffffff7fffffff;
            auVar301._8_4_ = ABS(fVar266);
            auVar301._12_4_ = ABS(fVar276);
            auVar226._0_8_ = CONCAT44(fVar190,fVar189) & 0x7fffffff7fffffff;
            auVar226._8_4_ = ABS(fVar192);
            auVar226._12_4_ = ABS(fVar193);
            auVar82 = maxps(auVar301,auVar226);
            auVar309._0_8_ =
                 CONCAT44(fVar81 * fVar237 +
                          fVar159 * fVar245 + fVar191 * fStack_2f4 + fVar247 * fStack_294,
                          fVar170 * fVar237 +
                          fVar156 * fVar245 + fVar188 * local_2f8 + fVar230 * local_298) &
                 0x7fffffff7fffffff;
            auVar309._8_4_ =
                 ABS(fVar117 * fVar237 +
                     fVar169 * fVar245 + fVar204 * fStack_2f0 + fVar256 * fStack_290);
            auVar309._12_4_ =
                 ABS(fVar154 * fVar237 +
                     fVar171 * fVar245 + fVar206 * fStack_2ec + fVar263 * fStack_28c);
            auVar82 = maxps(auVar82,auVar309);
            uVar77 = -(uint)(local_458 <= auVar82._0_4_);
            uVar76 = -(uint)(local_458 <= auVar82._4_4_);
            uVar78 = -(uint)(local_458 <= auVar82._8_4_);
            uVar79 = -(uint)(local_458 <= auVar82._12_4_);
            auVar227._0_4_ = ~uVar77 & (uint)fVar265;
            auVar227._4_4_ = ~uVar76 & (uint)fVar275;
            auVar227._8_4_ = ~uVar78 & (uint)fVar278;
            auVar227._12_4_ = ~uVar79 & (uint)fVar283;
            auVar289._0_4_ = (uint)fVar248 & uVar77;
            auVar289._4_4_ = (uint)fVar250 & uVar76;
            auVar289._8_4_ = (uint)fVar266 & uVar78;
            auVar289._12_4_ = (uint)fVar276 & uVar79;
            auVar289 = auVar289 | auVar227;
            fVar189 = (float)(~uVar77 & (uint)fVar264 | (uint)fVar189 & uVar77);
            fVar190 = (float)(~uVar76 & (uint)fVar305 | (uint)fVar190 & uVar76);
            fVar192 = (float)(~uVar78 & (uint)fVar252 | (uint)fVar192 & uVar78);
            fVar193 = (float)(~uVar79 & (uint)fVar255 | (uint)fVar193 & uVar79);
            auVar310._0_8_ = CONCAT44(fVar281,fVar279) & 0x7fffffff7fffffff;
            auVar310._8_4_ = ABS(fVar317);
            auVar310._12_4_ = ABS(fVar318);
            auVar163._0_8_ = CONCAT44(fVar321,fVar319) & 0x7fffffff7fffffff;
            auVar163._8_4_ = ABS(fVar320);
            auVar163._12_4_ = ABS(fVar322);
            auVar82 = maxps(auVar310,auVar163);
            auVar107._0_8_ =
                 CONCAT44(fVar302 * fVar237 +
                          fVar282 * fVar245 + fVar311 * fStack_2f4 + fVar251 * fStack_294,
                          fVar254 * fVar237 +
                          fVar280 * fVar245 + fVar306 * local_2f8 + fVar249 * local_298) &
                 0x7fffffff7fffffff;
            auVar107._8_4_ =
                 ABS(fVar303 * fVar237 +
                     fVar120 * fVar245 + fVar312 * fStack_2f0 + fVar267 * fStack_290);
            auVar107._12_4_ =
                 ABS(fVar304 * fVar237 +
                     fVar155 * fVar245 + fVar313 * fStack_2ec + fVar277 * fStack_28c);
            auVar82 = maxps(auVar82,auVar107);
            uVar77 = -(uint)(local_458 <= auVar82._0_4_);
            uVar76 = -(uint)(local_458 <= auVar82._4_4_);
            uVar78 = -(uint)(local_458 <= auVar82._8_4_);
            uVar79 = -(uint)(local_458 <= auVar82._12_4_);
            fVar267 = (float)((uint)fVar279 & uVar77 | ~uVar77 & (uint)fVar265);
            fVar277 = (float)((uint)fVar281 & uVar76 | ~uVar76 & (uint)fVar275);
            fVar280 = (float)((uint)fVar317 & uVar78 | ~uVar78 & (uint)fVar278);
            fVar282 = (float)((uint)fVar318 & uVar79 | ~uVar79 & (uint)fVar283);
            fVar275 = (float)(~uVar77 & (uint)fVar264 | (uint)fVar319 & uVar77);
            fVar283 = (float)(~uVar76 & (uint)fVar305 | (uint)fVar321 & uVar76);
            fVar302 = (float)(~uVar78 & (uint)fVar252 | (uint)fVar320 & uVar78);
            fVar255 = (float)(~uVar79 & (uint)fVar255 | (uint)fVar322 & uVar79);
            fVar171 = auVar289._0_4_;
            fVar170 = auVar289._4_4_;
            fVar81 = auVar289._8_4_;
            fVar117 = auVar289._12_4_;
            auVar200._0_4_ = fVar189 * fVar189 + fVar171 * fVar171;
            auVar200._4_4_ = fVar190 * fVar190 + fVar170 * fVar170;
            auVar200._8_4_ = fVar192 * fVar192 + fVar81 * fVar81;
            auVar200._12_4_ = fVar193 * fVar193 + fVar117 * fVar117;
            auVar82 = rsqrtps(auVar227,auVar200);
            fVar154 = auVar82._0_4_;
            fVar156 = auVar82._4_4_;
            fVar159 = auVar82._8_4_;
            fVar169 = auVar82._12_4_;
            auVar228._0_4_ = fVar154 * fVar154 * auVar200._0_4_ * 0.5 * fVar154;
            auVar228._4_4_ = fVar156 * fVar156 * auVar200._4_4_ * 0.5 * fVar156;
            auVar228._8_4_ = fVar159 * fVar159 * auVar200._8_4_ * 0.5 * fVar159;
            auVar228._12_4_ = fVar169 * fVar169 * auVar200._12_4_ * 0.5 * fVar169;
            fVar230 = fVar154 * 1.5 - auVar228._0_4_;
            fVar247 = fVar156 * 1.5 - auVar228._4_4_;
            fVar256 = fVar159 * 1.5 - auVar228._8_4_;
            fVar263 = fVar169 * 1.5 - auVar228._12_4_;
            auVar201._0_4_ = fVar275 * fVar275 + fVar267 * fVar267;
            auVar201._4_4_ = fVar283 * fVar283 + fVar277 * fVar277;
            auVar201._8_4_ = fVar302 * fVar302 + fVar280 * fVar280;
            auVar201._12_4_ = fVar255 * fVar255 + fVar282 * fVar282;
            auVar82 = rsqrtps(auVar228,auVar201);
            fVar154 = auVar82._0_4_;
            fVar156 = auVar82._4_4_;
            fVar159 = auVar82._8_4_;
            fVar169 = auVar82._12_4_;
            fVar188 = fVar154 * 1.5 - fVar154 * fVar154 * auVar201._0_4_ * 0.5 * fVar154;
            fVar191 = fVar156 * 1.5 - fVar156 * fVar156 * auVar201._4_4_ * 0.5 * fVar156;
            fVar204 = fVar159 * 1.5 - fVar159 * fVar159 * auVar201._8_4_ * 0.5 * fVar159;
            fVar206 = fVar169 * 1.5 - fVar169 * fVar169 * auVar201._12_4_ * 0.5 * fVar169;
            fVar265 = fVar189 * fVar230 * auVar140._0_4_;
            fVar278 = fVar190 * fVar247 * auVar140._4_4_;
            fVar306 = fVar192 * fVar256 * auVar140._8_4_;
            fVar311 = fVar193 * fVar263 * auVar140._12_4_;
            fVar156 = -fVar171 * fVar230 * auVar140._0_4_;
            fVar159 = -fVar170 * fVar247 * auVar140._4_4_;
            fVar169 = -fVar81 * fVar256 * auVar140._8_4_;
            fVar171 = -fVar117 * fVar263 * auVar140._12_4_;
            fVar264 = fVar230 * 0.0 * auVar140._0_4_;
            fVar305 = fVar247 * 0.0 * auVar140._4_4_;
            fVar252 = fVar256 * 0.0 * auVar140._8_4_;
            fVar254 = fVar263 * 0.0 * auVar140._12_4_;
            local_318 = fVar194 + fVar264;
            fStack_314 = fVar195 + fVar305;
            fStack_310 = fVar238 + fVar252;
            fStack_30c = fVar246 + fVar254;
            fVar303 = fVar275 * fVar188 * auVar315._0_4_;
            fVar304 = fVar283 * fVar191 * auVar315._4_4_;
            fVar192 = fVar302 * fVar204 * auVar315._8_4_;
            fVar193 = fVar255 * fVar206 * auVar315._12_4_;
            fVar312 = local_248 + fVar303;
            fVar313 = fStack_244 + fVar304;
            fVar249 = fStack_240 + fVar192;
            fVar251 = fStack_23c + fVar193;
            fVar170 = -fVar267 * fVar188 * auVar315._0_4_;
            fVar81 = -fVar277 * fVar191 * auVar315._4_4_;
            fVar117 = -fVar280 * fVar204 * auVar315._8_4_;
            fVar154 = -fVar282 * fVar206 * auVar315._12_4_;
            fVar267 = fVar290 + fVar170;
            fVar277 = fVar291 + fVar81;
            fVar280 = fVar292 + fVar117;
            fVar282 = fVar293 + fVar154;
            fVar230 = fVar188 * 0.0 * auVar315._0_4_;
            fVar247 = fVar191 * 0.0 * auVar315._4_4_;
            fVar256 = fVar204 * 0.0 * auVar315._8_4_;
            fVar263 = fVar206 * 0.0 * auVar315._12_4_;
            fVar188 = local_308 - fVar265;
            fVar191 = fStack_304 - fVar278;
            fVar204 = fStack_300 - fVar306;
            fVar206 = fStack_2fc - fVar311;
            fVar120 = fVar157 + fVar230;
            fVar155 = fVar158 + fVar247;
            fVar189 = fVar172 + fVar256;
            fVar190 = fVar173 + fVar263;
            fVar255 = local_258 - fVar156;
            fVar275 = fStack_254 - fVar159;
            fVar283 = fStack_250 - fVar169;
            fVar302 = fStack_24c - fVar171;
            fVar194 = fVar194 - fVar264;
            fVar195 = fVar195 - fVar305;
            fVar238 = fVar238 - fVar252;
            fVar246 = fVar246 - fVar254;
            uVar77 = -(uint)(0.0 < (fVar255 * (fVar120 - fVar194) - fVar194 * (fVar267 - fVar255)) *
                                   0.0 + (fVar194 * (fVar312 - fVar188) -
                                         (fVar120 - fVar194) * fVar188) * 0.0 +
                                         ((fVar267 - fVar255) * fVar188 -
                                         (fVar312 - fVar188) * fVar255));
            uVar76 = -(uint)(0.0 < (fVar275 * (fVar155 - fVar195) - fVar195 * (fVar277 - fVar275)) *
                                   0.0 + (fVar195 * (fVar313 - fVar191) -
                                         (fVar155 - fVar195) * fVar191) * 0.0 +
                                         ((fVar277 - fVar275) * fVar191 -
                                         (fVar313 - fVar191) * fVar275));
            uVar78 = -(uint)(0.0 < (fVar283 * (fVar189 - fVar238) - fVar238 * (fVar280 - fVar283)) *
                                   0.0 + (fVar238 * (fVar249 - fVar204) -
                                         (fVar189 - fVar238) * fVar204) * 0.0 +
                                         ((fVar280 - fVar283) * fVar204 -
                                         (fVar249 - fVar204) * fVar283));
            uVar79 = -(uint)(0.0 < (fVar302 * (fVar190 - fVar246) - fVar246 * (fVar282 - fVar302)) *
                                   0.0 + (fVar246 * (fVar251 - fVar206) -
                                         (fVar190 - fVar246) * fVar206) * 0.0 +
                                         ((fVar282 - fVar302) * fVar206 -
                                         (fVar251 - fVar206) * fVar302));
            fVar303 = (float)((uint)(local_248 - fVar303) & uVar77 |
                             ~uVar77 & (uint)(local_308 + fVar265));
            fVar304 = (float)((uint)(fStack_244 - fVar304) & uVar76 |
                             ~uVar76 & (uint)(fStack_304 + fVar278));
            fVar306 = (float)((uint)(fStack_240 - fVar192) & uVar78 |
                             ~uVar78 & (uint)(fStack_300 + fVar306));
            fVar311 = (float)((uint)(fStack_23c - fVar193) & uVar79 |
                             ~uVar79 & (uint)(fStack_2fc + fVar311));
            fVar192 = (float)((uint)(fVar290 - fVar170) & uVar77 |
                             ~uVar77 & (uint)(local_258 + fVar156));
            fVar193 = (float)((uint)(fVar291 - fVar81) & uVar76 |
                             ~uVar76 & (uint)(fStack_254 + fVar159));
            fVar248 = (float)((uint)(fVar292 - fVar117) & uVar78 |
                             ~uVar78 & (uint)(fStack_250 + fVar169));
            fVar250 = (float)((uint)(fVar293 - fVar154) & uVar79 |
                             ~uVar79 & (uint)(fStack_24c + fVar171));
            fVar156 = (float)((uint)(fVar157 - fVar230) & uVar77 | ~uVar77 & (uint)local_318);
            fVar159 = (float)((uint)(fVar158 - fVar247) & uVar76 | ~uVar76 & (uint)fStack_314);
            fVar169 = (float)((uint)(fVar172 - fVar256) & uVar78 | ~uVar78 & (uint)fStack_310);
            fVar171 = (float)((uint)(fVar173 - fVar263) & uVar79 | ~uVar79 & (uint)fStack_30c);
            fVar264 = (float)((uint)fVar188 & uVar77 | ~uVar77 & (uint)fVar312);
            fVar305 = (float)((uint)fVar191 & uVar76 | ~uVar76 & (uint)fVar313);
            fVar252 = (float)((uint)fVar204 & uVar78 | ~uVar78 & (uint)fVar249);
            fVar254 = (float)((uint)fVar206 & uVar79 | ~uVar79 & (uint)fVar251);
            fVar265 = (float)((uint)fVar255 & uVar77 | ~uVar77 & (uint)fVar267);
            fVar278 = (float)((uint)fVar275 & uVar76 | ~uVar76 & (uint)fVar277);
            fVar290 = (float)((uint)fVar283 & uVar78 | ~uVar78 & (uint)fVar280);
            fVar291 = (float)((uint)fVar302 & uVar79 | ~uVar79 & (uint)fVar282);
            fVar230 = (float)((uint)fVar194 & uVar77 | ~uVar77 & (uint)fVar120);
            fVar247 = (float)((uint)fVar195 & uVar76 | ~uVar76 & (uint)fVar155);
            fVar256 = (float)((uint)fVar238 & uVar78 | ~uVar78 & (uint)fVar189);
            fVar263 = (float)((uint)fVar246 & uVar79 | ~uVar79 & (uint)fVar190);
            fVar292 = (float)((uint)fVar312 & uVar77 | ~uVar77 & (uint)fVar188) - fVar303;
            fVar293 = (float)((uint)fVar313 & uVar76 | ~uVar76 & (uint)fVar191) - fVar304;
            fVar312 = (float)((uint)fVar249 & uVar78 | ~uVar78 & (uint)fVar204) - fVar306;
            fVar313 = (float)((uint)fVar251 & uVar79 | ~uVar79 & (uint)fVar206) - fVar311;
            fVar255 = (float)((uint)fVar267 & uVar77 | ~uVar77 & (uint)fVar255) - fVar192;
            fVar275 = (float)((uint)fVar277 & uVar76 | ~uVar76 & (uint)fVar275) - fVar193;
            fVar283 = (float)((uint)fVar280 & uVar78 | ~uVar78 & (uint)fVar283) - fVar248;
            fVar302 = (float)((uint)fVar282 & uVar79 | ~uVar79 & (uint)fVar302) - fVar250;
            fVar249 = (float)((uint)fVar120 & uVar77 | ~uVar77 & (uint)fVar194) - fVar156;
            fVar251 = (float)((uint)fVar155 & uVar76 | ~uVar76 & (uint)fVar195) - fVar159;
            fVar267 = (float)((uint)fVar189 & uVar78 | ~uVar78 & (uint)fVar238) - fVar169;
            fVar277 = (float)((uint)fVar190 & uVar79 | ~uVar79 & (uint)fVar246) - fVar171;
            fVar157 = fVar303 - fVar264;
            fVar158 = fVar304 - fVar305;
            fVar172 = fVar306 - fVar252;
            fVar173 = fVar311 - fVar254;
            fVar170 = fVar192 - fVar265;
            fVar81 = fVar193 - fVar278;
            fVar117 = fVar248 - fVar290;
            fVar154 = fVar250 - fVar291;
            fVar188 = fVar156 - fVar230;
            fVar191 = fVar159 - fVar247;
            fVar204 = fVar169 - fVar256;
            fVar206 = fVar171 - fVar263;
            fVar280 = (fVar192 * fVar249 - fVar156 * fVar255) * 0.0 +
                      (fVar156 * fVar292 - fVar303 * fVar249) * 0.0 +
                      (fVar303 * fVar255 - fVar192 * fVar292);
            fVar282 = (fVar193 * fVar251 - fVar159 * fVar275) * 0.0 +
                      (fVar159 * fVar293 - fVar304 * fVar251) * 0.0 +
                      (fVar304 * fVar275 - fVar193 * fVar293);
            auVar183._4_4_ = fVar282;
            auVar183._0_4_ = fVar280;
            fVar120 = (fVar248 * fVar267 - fVar169 * fVar283) * 0.0 +
                      (fVar169 * fVar312 - fVar306 * fVar267) * 0.0 +
                      (fVar306 * fVar283 - fVar248 * fVar312);
            fVar155 = (fVar250 * fVar277 - fVar171 * fVar302) * 0.0 +
                      (fVar171 * fVar313 - fVar311 * fVar277) * 0.0 +
                      (fVar311 * fVar302 - fVar250 * fVar313);
            auVar316._0_4_ =
                 (fVar265 * fVar188 - fVar230 * fVar170) * 0.0 +
                 (fVar230 * fVar157 - fVar264 * fVar188) * 0.0 +
                 (fVar264 * fVar170 - fVar265 * fVar157);
            auVar316._4_4_ =
                 (fVar278 * fVar191 - fVar247 * fVar81) * 0.0 +
                 (fVar247 * fVar158 - fVar305 * fVar191) * 0.0 +
                 (fVar305 * fVar81 - fVar278 * fVar158);
            auVar316._8_4_ =
                 (fVar290 * fVar204 - fVar256 * fVar117) * 0.0 +
                 (fVar256 * fVar172 - fVar252 * fVar204) * 0.0 +
                 (fVar252 * fVar117 - fVar290 * fVar172);
            auVar316._12_4_ =
                 (fVar291 * fVar206 - fVar263 * fVar154) * 0.0 +
                 (fVar263 * fVar173 - fVar254 * fVar206) * 0.0 +
                 (fVar254 * fVar154 - fVar291 * fVar173);
            auVar183._8_4_ = fVar120;
            auVar183._12_4_ = fVar155;
            auVar82 = maxps(auVar183,auVar316);
            bVar54 = auVar82._0_4_ <= 0.0 && bVar54;
            auVar184._0_4_ = -(uint)bVar54;
            bVar55 = auVar82._4_4_ <= 0.0 && bVar55;
            auVar184._4_4_ = -(uint)bVar55;
            bVar53 = auVar82._8_4_ <= 0.0 && bVar53;
            auVar184._8_4_ = -(uint)bVar53;
            bVar52 = auVar82._12_4_ <= 0.0 && bVar52;
            auVar184._12_4_ = -(uint)bVar52;
            iVar57 = movmskps((int)(bezier_basis1 + lVar26),auVar184);
            if (iVar57 == 0) {
              auVar165._8_8_ = uStack_3c0;
              auVar165._0_8_ = local_3c8;
              iVar57 = 0;
            }
            else {
              fVar247 = fVar170 * fVar249 - fVar188 * fVar255;
              fVar256 = fVar81 * fVar251 - fVar191 * fVar275;
              fVar263 = fVar117 * fVar267 - fVar204 * fVar283;
              fVar264 = fVar154 * fVar277 - fVar206 * fVar302;
              fVar230 = fVar188 * fVar292 - fVar249 * fVar157;
              fVar191 = fVar191 * fVar293 - fVar251 * fVar158;
              fVar204 = fVar204 * fVar312 - fVar267 * fVar172;
              fVar206 = fVar206 * fVar313 - fVar277 * fVar173;
              fVar170 = fVar157 * fVar255 - fVar170 * fVar292;
              fVar305 = fVar158 * fVar275 - fVar81 * fVar293;
              fVar252 = fVar172 * fVar283 - fVar117 * fVar312;
              fVar254 = fVar173 * fVar302 - fVar154 * fVar313;
              auVar164._0_4_ = fVar230 * 0.0 + fVar170;
              auVar164._4_4_ = fVar191 * 0.0 + fVar305;
              auVar164._8_4_ = fVar204 * 0.0 + fVar252;
              auVar164._12_4_ = fVar206 * 0.0 + fVar254;
              auVar234._0_4_ = fVar247 * 0.0 + auVar164._0_4_;
              auVar234._4_4_ = fVar256 * 0.0 + auVar164._4_4_;
              auVar234._8_4_ = fVar263 * 0.0 + auVar164._8_4_;
              auVar234._12_4_ = fVar264 * 0.0 + auVar164._12_4_;
              auVar82 = rcpps(auVar164,auVar234);
              fVar81 = auVar82._0_4_;
              fVar117 = auVar82._4_4_;
              fVar154 = auVar82._8_4_;
              fVar188 = auVar82._12_4_;
              fVar81 = (1.0 - auVar234._0_4_ * fVar81) * fVar81 + fVar81;
              fVar117 = (1.0 - auVar234._4_4_ * fVar117) * fVar117 + fVar117;
              fVar154 = (1.0 - auVar234._8_4_ * fVar154) * fVar154 + fVar154;
              fVar188 = (1.0 - auVar234._12_4_ * fVar188) * fVar188 + fVar188;
              fVar156 = (fVar156 * fVar170 + fVar192 * fVar230 + fVar303 * fVar247) * fVar81;
              fVar159 = (fVar159 * fVar305 + fVar193 * fVar191 + fVar304 * fVar256) * fVar117;
              fVar169 = (fVar169 * fVar252 + fVar248 * fVar204 + fVar306 * fVar263) * fVar154;
              fVar171 = (fVar171 * fVar254 + fVar250 * fVar206 + fVar311 * fVar264) * fVar188;
              fVar170 = *(float *)(ray + k * 4 + 0x80);
              bVar54 = (fVar156 <= fVar170 && (float)local_388._0_4_ <= fVar156) && bVar54;
              auVar202._0_4_ = -(uint)bVar54;
              bVar55 = (fVar159 <= fVar170 && (float)local_388._4_4_ <= fVar159) && bVar55;
              auVar202._4_4_ = -(uint)bVar55;
              bVar53 = (fVar169 <= fVar170 && fStack_380 <= fVar169) && bVar53;
              auVar202._8_4_ = -(uint)bVar53;
              bVar52 = (fVar171 <= fVar170 && fStack_37c <= fVar171) && bVar52;
              auVar202._12_4_ = -(uint)bVar52;
              iVar57 = movmskps(iVar57,auVar202);
              if (iVar57 == 0) {
                auVar165._8_8_ = uStack_3c0;
                auVar165._0_8_ = local_3c8;
                iVar57 = 0;
              }
              else {
                auVar203._0_8_ =
                     CONCAT44(-(uint)(auVar234._4_4_ != 0.0 && bVar55),
                              -(uint)(auVar234._0_4_ != 0.0 && bVar54));
                auVar203._8_4_ = -(uint)(auVar234._8_4_ != 0.0 && bVar53);
                auVar203._12_4_ = -(uint)(auVar234._12_4_ != 0.0 && bVar52);
                iVar57 = movmskps(iVar57,auVar203);
                auVar165._8_8_ = uStack_3c0;
                auVar165._0_8_ = local_3c8;
                if (iVar57 != 0) {
                  fVar280 = fVar280 * fVar81;
                  fVar282 = fVar282 * fVar117;
                  fVar120 = fVar120 * fVar154;
                  fVar155 = fVar155 * fVar188;
                  local_338 = (float)((uint)(1.0 - fVar280) & uVar77 | ~uVar77 & (uint)fVar280);
                  fStack_334 = (float)((uint)(1.0 - fVar282) & uVar76 | ~uVar76 & (uint)fVar282);
                  fStack_330 = (float)((uint)(1.0 - fVar120) & uVar78 | ~uVar78 & (uint)fVar120);
                  fStack_32c = (float)((uint)(1.0 - fVar155) & uVar79 | ~uVar79 & (uint)fVar155);
                  local_3d8 = (float)(~uVar77 & (uint)(auVar316._0_4_ * fVar81) |
                                     (uint)(1.0 - auVar316._0_4_ * fVar81) & uVar77);
                  fStack_3d4 = (float)(~uVar76 & (uint)(auVar316._4_4_ * fVar117) |
                                      (uint)(1.0 - auVar316._4_4_ * fVar117) & uVar76);
                  fStack_3d0 = (float)(~uVar78 & (uint)(auVar316._8_4_ * fVar154) |
                                      (uint)(1.0 - auVar316._8_4_ * fVar154) & uVar78);
                  fStack_3cc = (float)(~uVar79 & (uint)(auVar316._12_4_ * fVar188) |
                                      (uint)(1.0 - auVar316._12_4_ * fVar188) & uVar79);
                  auVar165._8_4_ = auVar203._8_4_;
                  auVar165._0_8_ = auVar203._0_8_;
                  auVar165._12_4_ = auVar203._12_4_;
                  local_348 = fVar156;
                  fStack_344 = fVar159;
                  fStack_340 = fVar169;
                  fStack_33c = fVar171;
                }
              }
            }
            iVar57 = movmskps(iVar57,auVar165);
            _local_278 = auVar244;
            if (iVar57 != 0) {
              fVar81 = (auVar315._0_4_ - auVar140._0_4_) * local_338 + auVar140._0_4_;
              fVar117 = (auVar315._4_4_ - auVar140._4_4_) * fStack_334 + auVar140._4_4_;
              fVar154 = (auVar315._8_4_ - auVar140._8_4_) * fStack_330 + auVar140._8_4_;
              fVar156 = (auVar315._12_4_ - auVar140._12_4_) * fStack_32c + auVar140._12_4_;
              fVar170 = *(float *)((long)local_3e0->ray_space + k * 4 + -0x10);
              auVar108._0_4_ = -(uint)(fVar170 * (fVar81 + fVar81) < local_348) & auVar165._0_4_;
              auVar108._4_4_ = -(uint)(fVar170 * (fVar117 + fVar117) < fStack_344) & auVar165._4_4_;
              auVar108._8_4_ = -(uint)(fVar170 * (fVar154 + fVar154) < fStack_340) & auVar165._8_4_;
              auVar108._12_4_ =
                   -(uint)(fVar170 * (fVar156 + fVar156) < fStack_33c) & auVar165._12_4_;
              iVar57 = movmskps((int)local_3e0,auVar108);
              if (iVar57 != 0) {
                local_3d8 = local_3d8 + local_3d8 + -1.0;
                fStack_3d4 = fStack_3d4 + fStack_3d4 + -1.0;
                fStack_3d0 = fStack_3d0 + fStack_3d0 + -1.0;
                fStack_3cc = fStack_3cc + fStack_3cc + -1.0;
                local_1e8 = local_348;
                fStack_1e4 = fStack_344;
                fStack_1e0 = fStack_340;
                fStack_1dc = fStack_33c;
                local_1c8 = CONCAT44(fVar205,fVar196);
                uStack_1c0 = CONCAT44(fVar231,fVar229);
                local_1b8 = CONCAT44(fStack_3a4,local_3a8);
                uStack_1b0 = CONCAT44(fStack_39c,fStack_3a0);
                local_1a8 = CONCAT44(fStack_3b4,local_3b8);
                uStack_1a0 = CONCAT44(fStack_3ac,fStack_3b0);
                local_198 = CONCAT44(fStack_394,local_398);
                uStack_190 = CONCAT44(fStack_38c,fStack_390);
                pGVar69 = (context->scene->geometries).items[(long)pRVar66].ptr;
                pRVar67 = pRVar66;
                local_208 = local_338;
                fStack_204 = fStack_334;
                fStack_200 = fStack_330;
                fStack_1fc = fStack_32c;
                local_1f8 = local_3d8;
                fStack_1f4 = fStack_3d4;
                fStack_1f0 = fStack_3d0;
                fStack_1ec = fStack_3cc;
                local_1d8 = uVar74;
                local_1d4 = iVar22;
                local_188 = auVar108;
                if ((pGVar69->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                  fVar170 = (float)(int)uVar74;
                  local_178[0] = (fVar170 + local_338 + 0.0) * local_88;
                  local_178[1] = (fVar170 + fStack_334 + 1.0) * fStack_84;
                  local_178[2] = (fVar170 + fStack_330 + 2.0) * fStack_80;
                  local_178[3] = (fVar170 + fStack_32c + 3.0) * fStack_7c;
                  local_168 = CONCAT44(fStack_3d4,local_3d8);
                  uStack_160 = CONCAT44(fStack_3cc,fStack_3d0);
                  local_158[0] = local_348;
                  local_158[1] = fStack_344;
                  local_158[2] = fStack_340;
                  local_158[3] = fStack_33c;
                  auVar141._0_4_ = auVar108._0_4_ & (uint)local_348;
                  auVar141._4_4_ = auVar108._4_4_ & (uint)fStack_344;
                  auVar141._8_4_ = auVar108._8_4_ & (uint)fStack_340;
                  auVar141._12_4_ = auVar108._12_4_ & (uint)fStack_33c;
                  auVar166._0_8_ = CONCAT44(~auVar108._4_4_,~auVar108._0_4_) & 0x7f8000007f800000;
                  auVar166._8_4_ = ~auVar108._8_4_ & 0x7f800000;
                  auVar166._12_4_ = ~auVar108._12_4_ & 0x7f800000;
                  auVar166 = auVar166 | auVar141;
                  auVar185._4_4_ = auVar166._0_4_;
                  auVar185._0_4_ = auVar166._4_4_;
                  auVar185._8_4_ = auVar166._12_4_;
                  auVar185._12_4_ = auVar166._8_4_;
                  auVar82 = minps(auVar185,auVar166);
                  auVar142._0_8_ = auVar82._8_8_;
                  auVar142._8_4_ = auVar82._0_4_;
                  auVar142._12_4_ = auVar82._4_4_;
                  auVar82 = minps(auVar142,auVar82);
                  auVar143._0_8_ =
                       CONCAT44(-(uint)(auVar82._4_4_ == auVar166._4_4_) & auVar108._4_4_,
                                -(uint)(auVar82._0_4_ == auVar166._0_4_) & auVar108._0_4_);
                  auVar143._8_4_ = -(uint)(auVar82._8_4_ == auVar166._8_4_) & auVar108._8_4_;
                  auVar143._12_4_ = -(uint)(auVar82._12_4_ == auVar166._12_4_) & auVar108._12_4_;
                  iVar57 = movmskps(*(uint *)(ray + k * 4 + 0x90),auVar143);
                  auVar109 = auVar108;
                  if (iVar57 != 0) {
                    auVar109._8_4_ = auVar143._8_4_;
                    auVar109._0_8_ = auVar143._0_8_;
                    auVar109._12_4_ = auVar143._12_4_;
                  }
                  uVar77 = movmskps(iVar57,auVar109);
                  lVar71 = 0;
                  if (uVar77 != 0) {
                    for (; (uVar77 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                    }
                  }
                  local_408 = auVar108;
                  if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                     (pGVar69->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                    fVar170 = local_178[lVar71];
                    uVar58 = *(undefined4 *)((long)&local_168 + lVar71 * 4);
                    fVar81 = 1.0 - fVar170;
                    fVar154 = fVar170 * fVar81 + fVar170 * fVar81;
                    fVar117 = fVar81 * fVar81 * -3.0;
                    fVar156 = (fVar81 * fVar81 - fVar154) * 3.0;
                    fVar81 = (fVar154 - fVar170 * fVar170) * 3.0;
                    fVar154 = fVar170 * fVar170 * 3.0;
                    *(float *)(ray + k * 4 + 0x80) = local_158[lVar71];
                    *(float *)(ray + k * 4 + 0xc0) =
                         fVar117 * fVar196 +
                         fVar156 * local_3a8 + fVar81 * local_3b8 + fVar154 * local_398;
                    *(float *)(ray + k * 4 + 0xd0) =
                         fVar117 * fVar205 +
                         fVar156 * fStack_3a4 + fVar81 * fStack_3b4 + fVar154 * fStack_394;
                    *(float *)(ray + k * 4 + 0xe0) =
                         fVar117 * fVar229 +
                         fVar156 * fStack_3a0 + fVar81 * fStack_3b0 + fVar154 * fStack_390;
                    *(float *)(ray + k * 4 + 0xf0) = fVar170;
                    *(undefined4 *)(ray + k * 4 + 0x100) = uVar58;
                    *(uint *)(ray + k * 4 + 0x110) = uVar75;
                    *(uint *)(ray + k * 4 + 0x120) = uVar73;
                    *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                    *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                    pRVar67 = (RTCIntersectArguments *)context;
                    prim = local_3e8;
                  }
                  else {
                    auVar82 = *local_2c8;
                    _local_518 = ZEXT416(*(uint *)(ray + k * 4 + 0x80));
                    fVar170 = local_348;
                    fVar81 = fStack_344;
                    fVar117 = fStack_340;
                    fVar154 = fStack_33c;
                    while( true ) {
                      local_e8 = local_178[lVar71];
                      local_d8 = *(undefined4 *)((long)&local_168 + lVar71 * 4);
                      *(float *)(ray + k * 4 + 0x80) = local_158[lVar71];
                      fVar156 = 1.0 - local_e8;
                      fVar169 = local_e8 * fVar156 + local_e8 * fVar156;
                      fVar171 = (fVar169 - local_e8 * local_e8) * 3.0;
                      fVar159 = local_e8 * local_e8 * 3.0;
                      fVar169 = (fVar156 * fVar156 - fVar169) * 3.0;
                      local_378.context = context->user;
                      fVar156 = fVar156 * fVar156 * -3.0;
                      local_118._0_4_ =
                           fVar156 * fVar196 +
                           fVar169 * local_3a8 + fVar171 * local_3b8 + fVar159 * local_398;
                      local_108 = fVar156 * fVar205 +
                                  fVar169 * fStack_3a4 + fVar171 * fStack_3b4 + fVar159 * fStack_394
                      ;
                      local_f8 = fVar156 * fVar229 +
                                 fVar169 * fStack_3a0 + fVar171 * fStack_3b0 + fVar159 * fStack_390;
                      local_118._4_4_ = local_118._0_4_;
                      local_118._8_4_ = local_118._0_4_;
                      fStack_10c = (float)local_118._0_4_;
                      fStack_104 = local_108;
                      fStack_100 = local_108;
                      fStack_fc = local_108;
                      fStack_f4 = local_f8;
                      fStack_f0 = local_f8;
                      fStack_ec = local_f8;
                      fStack_e4 = local_e8;
                      fStack_e0 = local_e8;
                      fStack_dc = local_e8;
                      uStack_d4 = local_d8;
                      uStack_d0 = local_d8;
                      uStack_cc = local_d8;
                      local_c8 = CONCAT44(uStack_74,local_78);
                      uStack_c0 = CONCAT44(uStack_6c,uStack_70);
                      local_b8 = CONCAT44(uStack_64,local_68);
                      uStack_b0 = CONCAT44(uStack_5c,uStack_60);
                      local_a8 = (local_378.context)->instID[0];
                      uStack_a4 = local_a8;
                      uStack_a0 = local_a8;
                      uStack_9c = local_a8;
                      local_98 = (local_378.context)->instPrimID[0];
                      uStack_94 = local_98;
                      uStack_90 = local_98;
                      uStack_8c = local_98;
                      local_378.valid = (int *)local_3f8;
                      pRVar67 = (RTCIntersectArguments *)pGVar69->userPtr;
                      local_378.hit = (RTCHitN *)local_118;
                      local_378.N = 4;
                      p_Var61 = pGVar69->intersectionFilterN;
                      local_3f8 = auVar82;
                      local_378.geometryUserPtr = pRVar67;
                      local_378.ray = (RTCRayN *)ray;
                      if (p_Var61 != (RTCFilterFunctionN)0x0) {
                        p_Var61 = (RTCFilterFunctionN)(*p_Var61)(&local_378);
                        fVar170 = local_348;
                        fVar81 = fStack_344;
                        fVar117 = fStack_340;
                        fVar154 = fStack_33c;
                      }
                      auVar144._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                      auVar144._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                      auVar144._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                      auVar144._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                      uVar77 = movmskps((int)p_Var61,auVar144);
                      pRVar62 = (RayHitK<4> *)(ulong)(uVar77 ^ 0xf);
                      if ((uVar77 ^ 0xf) == 0) {
                        auVar144 = auVar144 ^ _DAT_01f7ae20;
                      }
                      else {
                        pRVar67 = context->args;
                        pRVar63 = (RTCIntersectArguments *)pRVar67->filter;
                        if ((pRVar63 != (RTCIntersectArguments *)0x0) &&
                           ((((ulong)*(Scene **)&pRVar67->flags & 2) != 0 ||
                            (((pGVar69->field_8).field_0x2 & 0x40) != 0)))) {
                          pRVar63 = (RTCIntersectArguments *)(*(code *)pRVar63)(&local_378);
                          fVar170 = local_348;
                          fVar81 = fStack_344;
                          fVar117 = fStack_340;
                          fVar154 = fStack_33c;
                        }
                        auVar110._0_4_ = -(uint)(local_3f8._0_4_ == 0);
                        auVar110._4_4_ = -(uint)(local_3f8._4_4_ == 0);
                        auVar110._8_4_ = -(uint)(local_3f8._8_4_ == 0);
                        auVar110._12_4_ = -(uint)(local_3f8._12_4_ == 0);
                        auVar144 = auVar110 ^ _DAT_01f7ae20;
                        uVar77 = movmskps((int)pRVar63,auVar110);
                        pRVar62 = (RayHitK<4> *)(ulong)(uVar77 ^ 0xf);
                        if ((uVar77 ^ 0xf) != 0) {
                          RVar28 = *(RTCFeatureFlags *)((long)local_378.hit + 4);
                          uVar77 = *(uint *)((long)local_378.hit + 8);
                          uVar74 = *(uint *)((long)((long)local_378.hit + 8) + 4);
                          *(uint *)(local_378.ray + 0xc0) =
                               ~auVar110._0_4_ & *(uint *)&(local_378.hit)->field_0x0 |
                               *(uint *)(local_378.ray + 0xc0) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xc4) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xc4) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 200) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 200) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0xcc) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0xcc) & auVar110._12_4_;
                          RVar28 = *(RTCFeatureFlags *)((long)((long)local_378.hit + 0x10) + 4);
                          uVar77 = *(uint *)((long)local_378.hit + 0x18);
                          uVar74 = *(uint *)((long)((long)local_378.hit + 0x18) + 4);
                          *(uint *)(local_378.ray + 0xd0) =
                               ~auVar110._0_4_ & *(uint *)((long)local_378.hit + 0x10) |
                               *(uint *)(local_378.ray + 0xd0) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xd4) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xd4) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 0xd8) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 0xd8) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0xdc) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0xdc) & auVar110._12_4_;
                          RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                   feature_mask;
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                             ->context;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x20))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0xe0) =
                               ~auVar110._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x20))->flags |
                               *(uint *)(local_378.ray + 0xe0) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xe4) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xe4) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 0xe8) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 0xe8) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0xec) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0xec) & auVar110._12_4_;
                          RVar28 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                            ->filter + 4);
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))
                                             ->intersect;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x20))->intersect + 4);
                          *(uint *)(local_378.ray + 0xf0) =
                               ~auVar110._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x20))->
                                         filter | *(uint *)(local_378.ray + 0xf0) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0xf4) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0xf4) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 0xf8) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 0xf8) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0xfc) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0xfc) & auVar110._12_4_;
                          RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                   feature_mask;
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                             ->context;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x40))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0x100) =
                               ~auVar110._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x40))->flags |
                               *(uint *)(local_378.ray + 0x100) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0x104) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0x104) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 0x108) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 0x108) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0x10c) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0x10c) & auVar110._12_4_;
                          RVar28 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                            ->filter + 4);
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))
                                             ->intersect;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x40))->intersect + 4);
                          *(uint *)(local_378.ray + 0x110) =
                               *(uint *)(local_378.ray + 0x110) & auVar110._0_4_ |
                               ~auVar110._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x40))->
                                         filter;
                          *(RTCFeatureFlags *)(local_378.ray + 0x114) =
                               *(RTCFeatureFlags *)(local_378.ray + 0x114) & auVar110._4_4_ |
                               ~auVar110._4_4_ & RVar28;
                          *(uint *)(local_378.ray + 0x118) =
                               *(uint *)(local_378.ray + 0x118) & auVar110._8_4_ |
                               ~auVar110._8_4_ & uVar77;
                          *(uint *)(local_378.ray + 0x11c) =
                               *(uint *)(local_378.ray + 0x11c) & auVar110._12_4_ |
                               ~auVar110._12_4_ & uVar74;
                          RVar28 = ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                   feature_mask;
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                             ->context;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x60))->context + 4);
                          *(RTCRayQueryFlags *)(local_378.ray + 0x120) =
                               *(uint *)(local_378.ray + 0x120) & auVar110._0_4_ |
                               ~auVar110._0_4_ &
                               ((RTCIntersectArguments *)((long)local_378.hit + 0x60))->flags;
                          *(RTCFeatureFlags *)(local_378.ray + 0x124) =
                               *(RTCFeatureFlags *)(local_378.ray + 0x124) & auVar110._4_4_ |
                               ~auVar110._4_4_ & RVar28;
                          *(uint *)(local_378.ray + 0x128) =
                               *(uint *)(local_378.ray + 0x128) & auVar110._8_4_ |
                               ~auVar110._8_4_ & uVar77;
                          *(uint *)(local_378.ray + 300) =
                               *(uint *)(local_378.ray + 300) & auVar110._12_4_ |
                               ~auVar110._12_4_ & uVar74;
                          RVar28 = *(RTCFeatureFlags *)
                                    ((long)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                            ->filter + 4);
                          uVar77 = *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))
                                             ->intersect;
                          uVar74 = *(uint *)((long)&((RTCIntersectArguments *)
                                                    ((long)local_378.hit + 0x60))->intersect + 4);
                          *(uint *)(local_378.ray + 0x130) =
                               ~auVar110._0_4_ &
                               *(uint *)&((RTCIntersectArguments *)((long)local_378.hit + 0x60))->
                                         filter | *(uint *)(local_378.ray + 0x130) & auVar110._0_4_;
                          *(RTCFeatureFlags *)(local_378.ray + 0x134) =
                               ~auVar110._4_4_ & RVar28 |
                               *(RTCFeatureFlags *)(local_378.ray + 0x134) & auVar110._4_4_;
                          *(uint *)(local_378.ray + 0x138) =
                               ~auVar110._8_4_ & uVar77 |
                               *(uint *)(local_378.ray + 0x138) & auVar110._8_4_;
                          *(uint *)(local_378.ray + 0x13c) =
                               ~auVar110._12_4_ & uVar74 |
                               *(uint *)(local_378.ray + 0x13c) & auVar110._12_4_;
                          auVar19._0_4_ = *(undefined4 *)(local_378.hit + 0x80);
                          auVar19._4_4_ = *(undefined4 *)(local_378.hit + 0x84);
                          auVar19._8_8_ = *(undefined8 *)(local_378.hit + 0x88);
                          *(undefined1 (*) [16])(local_378.ray + 0x140) =
                               ~auVar110 & auVar19 |
                               *(undefined1 (*) [16])(local_378.ray + 0x140) & auVar110;
                          pRVar62 = (RayHitK<4> *)local_378.ray;
                          pRVar67 = (RTCIntersectArguments *)local_378.hit;
                        }
                      }
                      auVar145._0_4_ = auVar144._0_4_ << 0x1f;
                      auVar145._4_4_ = auVar144._4_4_ << 0x1f;
                      auVar145._8_4_ = auVar144._8_4_ << 0x1f;
                      auVar145._12_4_ = auVar144._12_4_ << 0x1f;
                      iVar57 = movmskps((int)pRVar62,auVar145);
                      if (iVar57 == 0) {
                        *(undefined4 *)(ray + k * 4 + 0x80) = local_518._0_4_;
                      }
                      else {
                        local_518._0_4_ = *(undefined4 *)(ray + k * 4 + 0x80);
                        local_518._4_4_ = 0;
                        fStack_510 = 0.0;
                        uStack_50c = 0;
                      }
                      *(undefined4 *)(local_408 + lVar71 * 4) = 0;
                      local_408._0_4_ = -(uint)(fVar170 <= (float)local_518._0_4_) & local_408._0_4_
                      ;
                      local_408._4_4_ = -(uint)(fVar81 <= (float)local_518._0_4_) & local_408._4_4_;
                      local_408._8_4_ = -(uint)(fVar117 <= (float)local_518._0_4_) & local_408._8_4_
                      ;
                      local_408._12_4_ =
                           -(uint)(fVar154 <= (float)local_518._0_4_) & local_408._12_4_;
                      iVar57 = movmskps(iVar57,local_408);
                      prim = local_3e8;
                      if (iVar57 == 0) break;
                      auVar146._0_4_ = local_408._0_4_ & (uint)fVar170;
                      auVar146._4_4_ = local_408._4_4_ & (uint)fVar81;
                      auVar146._8_4_ = local_408._8_4_ & (uint)fVar117;
                      auVar146._12_4_ = local_408._12_4_ & (uint)fVar154;
                      auVar167._0_8_ =
                           CONCAT44(~local_408._4_4_,~local_408._0_4_) & 0x7f8000007f800000;
                      auVar167._8_4_ = ~local_408._8_4_ & 0x7f800000;
                      auVar167._12_4_ = ~local_408._12_4_ & 0x7f800000;
                      auVar167 = auVar167 | auVar146;
                      auVar186._4_4_ = auVar167._0_4_;
                      auVar186._0_4_ = auVar167._4_4_;
                      auVar186._8_4_ = auVar167._12_4_;
                      auVar186._12_4_ = auVar167._8_4_;
                      auVar161 = minps(auVar186,auVar167);
                      auVar147._0_8_ = auVar161._8_8_;
                      auVar147._8_4_ = auVar161._0_4_;
                      auVar147._12_4_ = auVar161._4_4_;
                      auVar161 = minps(auVar147,auVar161);
                      auVar148._0_8_ =
                           CONCAT44(-(uint)(auVar161._4_4_ == auVar167._4_4_) & local_408._4_4_,
                                    -(uint)(auVar161._0_4_ == auVar167._0_4_) & local_408._0_4_);
                      auVar148._8_4_ = -(uint)(auVar161._8_4_ == auVar167._8_4_) & local_408._8_4_;
                      auVar148._12_4_ =
                           -(uint)(auVar161._12_4_ == auVar167._12_4_) & local_408._12_4_;
                      iVar57 = movmskps(iVar57,auVar148);
                      auVar111 = local_408;
                      if (iVar57 != 0) {
                        auVar111._8_4_ = auVar148._8_4_;
                        auVar111._0_8_ = auVar148._0_8_;
                        auVar111._12_4_ = auVar148._12_4_;
                      }
                      uVar58 = movmskps(iVar57,auVar111);
                      uVar64 = CONCAT44((int)((ulong)pRVar62 >> 0x20),uVar58);
                      lVar71 = 0;
                      if (uVar64 != 0) {
                        for (; (uVar64 >> lVar71 & 1) == 0; lVar71 = lVar71 + 1) {
                        }
                      }
                    }
                  }
                }
              }
            }
          }
          iVar65 = (int)pRVar67;
          lVar70 = lVar70 + 4;
        } while ((int)lVar70 < iVar22);
      }
      fVar170 = *(float *)(ray + k * 4 + 0x80);
      auVar139._4_4_ = -(uint)(fStack_44 <= fVar170);
      auVar139._0_4_ = -(uint)(local_48 <= fVar170);
      auVar139._8_4_ = -(uint)(fStack_40 <= fVar170);
      auVar139._12_4_ = -(uint)(fStack_3c <= fVar170);
      uVar73 = movmskps(iVar65,auVar139);
      uVar72 = uVar72 & uVar72 + 0xf & uVar73;
    } while (uVar72 != 0);
  }
  return;
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }